

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeInternalForces
          (ChElementShellReissner4 *this,ChVectorDynamic<> *Fi)

{
  ChMatrix33<double> *pCVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long *plVar41;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var42;
  pointer pdVar43;
  long lVar44;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  void *pvVar56;
  undefined8 uVar57;
  ChMatrixNM<double,_15,_15> *pCVar58;
  ChVectorN<double,_12> *pCVar59;
  ChMatrix33<double> (*paCVar60) [4];
  ChVectorDynamic<> *pCVar61;
  Index index;
  double *pdVar62;
  PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *pPVar63;
  pointer pLVar64;
  Index index_3;
  ChVector<double> *pCVar65;
  char *__function;
  Index index_4;
  double *pdVar66;
  LhsNested LVar67;
  ulong *puVar68;
  ChVector<double> *pCVar69;
  int iVar70;
  ActualDstType actualDst;
  long lVar71;
  ChVector<double> *pCVar72;
  ChMatrixNM<double,_12,_24> *lhs;
  double *pdVar73;
  ChMatrixNM<double,_4,_2> *pCVar74;
  double *pdVar75;
  long lVar76;
  ChMatrixNM<double,_15,_15> *pCVar77;
  uint uVar78;
  Index inner;
  double *pdVar79;
  long lVar80;
  uint uVar81;
  double *pdVar82;
  double *pdVar83;
  Index *__s;
  int i;
  ChMatrixNM<double,_15,_24> *pCVar84;
  ulong uVar85;
  ulong uVar86;
  Scalar *dst_ptr;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  double dVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  double dVar187;
  undefined1 auVar188 [16];
  undefined1 in_ZMM18 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  Index alignedEnd;
  Index alignedStart_2;
  ChVectorN<double,_12> strain_dt;
  ChVector<double> phi_tilde_1_i;
  Index alignedStart_1;
  ChStateDelta velocities;
  ChVector<double> n2;
  ChVector<double> n1;
  ChVector<double> m1;
  ChVector<double> phi_tilde_2_i;
  ChStarMatrix33<double> mk_1_X;
  ChVector<double> eps_tot_2;
  ChVector<double> eps_tot_1;
  ChVectorN<double,_12> stress_damp;
  ChVector<double> l_n1;
  ChVector<double> k_tot_2;
  ChVector<double> k_tot_1;
  ChMatrix33<double> T_3;
  ChVector<double> n1_1;
  DstEvaluatorType dstEvaluator;
  ChVector<double> l_m2;
  ChVector<double> l_m1;
  ChVector<double> l_n2;
  ChVector<double> y_A_2;
  ChVector<double> y_A_1;
  ChVectorN<double,_24> rd;
  ChMatrixNM<double,_6,_24> B_overline_A;
  ChMatrixNM<double,_4,_24> B_overline_6_ABCD;
  ChMatrixNM<double,_4,_24> B_overline_3_ABCD;
  double *local_1368;
  undefined1 local_1360 [16];
  undefined1 local_1340 [16];
  double *local_1328;
  ChMatrix33<double> local_1320;
  undefined1 local_12d8 [24];
  undefined1 local_12c0 [16];
  variable_if_dynamic<long,__1> vStack_12b0;
  undefined1 auStack_12a8 [40];
  ulong local_1280;
  double *local_1278;
  undefined1 local_1270 [16];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  local_1258;
  ulong uStack_1228;
  undefined8 local_1220;
  undefined8 local_1218;
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  double local_11f0;
  double dStack_11e8;
  double local_11e0;
  undefined1 local_11d0 [40];
  ulong uStack_11a8;
  undefined1 local_11a0 [16];
  void *local_1188;
  void *local_1180;
  double *local_1178;
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  const_blas_data_mapper<double,_long,_0> local_1140;
  double local_1130;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_1120;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined8 local_10f0;
  undefined8 local_10e8;
  undefined8 local_10e0;
  ChMatrixNM<double,_15,_15> *local_10d0;
  double *local_10c8;
  double *local_10c0;
  double *local_10b8;
  double *local_10b0;
  ChVector<double> *local_10a8;
  ChVector<double> *local_10a0;
  ChVector<double> *local_1098;
  undefined1 local_1090 [16];
  Matrix<double,_3,_3,_1,_3,_3> local_1080;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
  *pCStack_1038;
  double dStack_1030;
  undefined1 *puStack_1028;
  undefined8 uStack_1020;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
  *pgStack_1018;
  undefined8 uStack_1010;
  Matrix<double,_3,_3,_1,_3,_3> *pMStack_1008;
  undefined8 local_1000;
  ChVector<double> *pCStack_ff8;
  undefined8 uStack_ff0;
  undefined1 *puStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  ChVector<double> local_fb0;
  ChVector<double> local_f90;
  ChMatrixNM<double,_12,_24> *local_f78;
  ChVector<double> *local_f70;
  ChVectorN<double,_12> *local_f68;
  ChMatrix33<double> (*local_f60) [4];
  ChVector<double> *local_f58;
  ChMatrix33<double> (*local_f50) [4];
  undefined8 *local_f48;
  Matrix<double,_3,_3,_1,_3,_3> local_f40;
  double *local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  double *local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  const_blas_data_mapper<double,_long,_1> local_e70;
  double local_e60;
  ChVectorDynamic<> *local_e58;
  ChVector<double> *local_e50;
  ChVector<double> *local_e48;
  ChMatrix33<double> *local_e40;
  ChVector<double> *local_e38;
  ChVector<double> *local_e30;
  ChVector<double> *local_e28;
  ChMatrixNM<double,_15,_24> *local_e20;
  double *local_e18;
  double *local_e10;
  double *local_e08;
  ChVector<double> local_e00;
  ChVector<double> local_de0;
  ChVector<double> local_dc8;
  double local_db0;
  double local_da8;
  double local_da0;
  double local_d98;
  double local_d90;
  double local_d88;
  undefined1 local_d80 [16];
  double dStack_d70;
  ulong uStack_d60;
  undefined1 auStack_d68 [40];
  ulong local_d40;
  Matrix<double,_3,_3,_1,_3,_3> local_d00;
  ulong local_ca0;
  ulong uStack_c98;
  double local_c90;
  double dStack_c88;
  double local_c80;
  double local_c70;
  double dStack_c68;
  double local_c60;
  double local_c50;
  double dStack_c48;
  double local_c40;
  ChVector<double> local_c30;
  ChVector<double> local_c10;
  ChMatrixNM<double,_15,_24> *local_bf8;
  ChVector<double> *local_bf0;
  ChVector<double> *local_be8;
  ChVector<double> *local_be0;
  ChVector<double> *local_bd8;
  ChMatrixNM<double,_4,_2> *local_bd0;
  long local_bc8;
  ChMatrix33<double> local_bc0;
  double dStack_b78;
  double dStack_b70;
  double dStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 local_b40 [64];
  Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false> local_b00;
  double dStack_ac8;
  double local_ac0;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  double local_680 [5];
  ulong auStack_658 [2];
  double adStack_648 [2];
  undefined1 auStack_638 [56];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  double local_380 [5];
  ulong auStack_358 [2];
  double adStack_348 [2];
  undefined1 auStack_338 [56];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  double *local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  lVar76 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar76 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar76 != 0) {
    memset((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,0,
           lVar76 << 3);
  }
  local_e58 = Fi;
  UpdateNodalAndAveragePosAndOrientation(this);
  InterpolateOrientation(this);
  ComputeIPCurvature(this);
  local_e28 = this->xa;
  local_bd0 = this->L_alpha_beta_i;
  local_e38 = this->y_i_1;
  local_f70 = this->y_i_2;
  local_e40 = this->T_i;
  local_1098 = this->eps_tilde_1_i;
  local_bd8 = this->eps_tilde_1_0_i;
  local_e30 = this->eps_tilde_2_i;
  local_be0 = this->eps_tilde_2_0_i;
  local_e48 = this->k_1_i;
  local_10a0 = this->k_tilde_1_i;
  local_be8 = this->k_tilde_1_0_i;
  local_e50 = this->k_2_i;
  local_ca0 = 0x8000000000000000;
  uStack_c98 = 0x8000000000000000;
  local_10a8 = this->k_tilde_2_i;
  local_bf0 = this->k_tilde_2_0_i;
  local_f50 = this->Phi_Delta_i;
  local_f78 = this->B_overline_i;
  local_f58 = this->phi_tilde_n;
  local_f60 = this->Kappa_delta_i_1;
  local_f68 = (ChVectorN<double,_12> *)this->Kappa_delta_i_2;
  pCVar84 = this->D_overline_i;
  pdVar62 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 3;
  pdVar66 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0x4b;
  pdVar73 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0x93;
  pdVar75 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0xdb;
  pCVar77 = (ChMatrixNM<double,_15,_15> *)
            (this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
             m_storage.m_data.array + 0x48);
  pdVar79 = this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
            m_storage.m_data.array + 0x93;
  pdVar82 = this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
            m_storage.m_data.array + 0xdb;
  pdVar83 = this->D_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_15,_24,_1,_15,_24>_>.
            m_storage.m_data.array + 0x123;
  lVar76 = 0;
  local_bf8 = pCVar84;
  do {
    pCVar65 = local_e38;
    pCVar74 = local_bd0 + lVar76;
    local_10d0 = pCVar77;
    local_10c8 = pdVar75;
    local_10c0 = pdVar73;
    local_10b8 = pdVar66;
    local_10b0 = pdVar62;
    local_e20 = pCVar84;
    local_e18 = pdVar83;
    local_e10 = pdVar82;
    local_e08 = pdVar79;
    InterpDeriv(local_e28,pCVar74,local_e38 + lVar76,local_f70 + lVar76);
    local_1188 = (void *)(lVar76 * 9);
    pCVar1 = local_e40 + lVar76;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = pCVar65[lVar76].m_data[0];
    dVar131 = pCVar65[lVar76].m_data[1];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = pCVar65[lVar76].m_data[2];
    auVar87._8_8_ = 0;
    auVar87._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar139._8_8_ = 0;
    auVar139._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar87 = vfmadd231sd_fma(auVar139,auVar99,auVar87);
    auVar88._8_8_ = 0;
    auVar88._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar87 = vfmadd231sd_fma(auVar87,auVar132,auVar88);
    dVar187 = local_bd8[lVar76].m_data[2];
    auVar89._8_8_ = 0;
    auVar89._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar146._8_8_ = 0;
    auVar146._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
    auVar88 = vfmadd231sd_fma(auVar146,auVar99,auVar89);
    auVar90._8_8_ = 0;
    auVar90._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar88 = vfmadd231sd_fma(auVar88,auVar132,auVar90);
    dVar3 = local_bd8[lVar76].m_data[1];
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar117._8_8_ = 0;
    auVar117._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar89 = vfmadd231sd_fma(auVar117,auVar99,auVar91);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar89 = vfmadd231sd_fma(auVar89,auVar132,auVar6);
    local_1098[lVar76].m_data[0] = auVar89._0_8_ - local_bd8[lVar76].m_data[0];
    local_1098[lVar76].m_data[1] = auVar88._0_8_ - dVar3;
    local_1098[lVar76].m_data[2] = auVar87._0_8_ - dVar187;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = local_f70[lVar76].m_data[0];
    dVar131 = local_f70[lVar76].m_data[1];
    auVar133._8_8_ = 0;
    auVar133._0_8_ = local_f70[lVar76].m_data[2];
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar140._8_8_ = 0;
    auVar140._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar87 = vfmadd231sd_fma(auVar140,auVar100,auVar7);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8];
    auVar87 = vfmadd231sd_fma(auVar87,auVar133,auVar8);
    dVar187 = local_be0[lVar76].m_data[2];
    auVar9._8_8_ = 0;
    auVar9._0_8_ = (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar147._8_8_ = 0;
    auVar147._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
    auVar88 = vfmadd231sd_fma(auVar147,auVar100,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar88 = vfmadd231sd_fma(auVar88,auVar133,auVar10);
    dVar3 = local_be0[lVar76].m_data[1];
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar118._8_8_ = 0;
    auVar118._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar89 = vfmadd231sd_fma(auVar118,auVar100,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar89 = vfmadd231sd_fma(auVar89,auVar133,auVar12);
    local_e30[lVar76].m_data[0] = auVar89._0_8_ - local_be0[lVar76].m_data[0];
    local_e30[lVar76].m_data[1] = auVar88._0_8_ - dVar3;
    local_e30[lVar76].m_data[2] = auVar87._0_8_ - dVar187;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = local_e48[lVar76].m_data[0];
    dVar131 = local_e48[lVar76].m_data[1];
    auVar134._8_8_ = 0;
    auVar134._0_8_ = local_e48[lVar76].m_data[2];
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar141._8_8_ = 0;
    auVar141._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar87 = vfmadd231sd_fma(auVar141,auVar101,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar87 = vfmadd231sd_fma(auVar87,auVar134,auVar14);
    dVar187 = local_be8[lVar76].m_data[2];
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar148._8_8_ = 0;
    auVar148._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
    auVar88 = vfmadd231sd_fma(auVar148,auVar101,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar88 = vfmadd231sd_fma(auVar88,auVar134,auVar16);
    dVar3 = local_be8[lVar76].m_data[1];
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar119._8_8_ = 0;
    auVar119._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar89 = vfmadd231sd_fma(auVar119,auVar101,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar89 = vfmadd231sd_fma(auVar89,auVar134,auVar18);
    local_10a0[lVar76].m_data[0] = auVar89._0_8_ - local_be8[lVar76].m_data[0];
    local_10a0[lVar76].m_data[1] = auVar88._0_8_ - dVar3;
    local_10a0[lVar76].m_data[2] = auVar87._0_8_ - dVar187;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = local_e50[lVar76].m_data[0];
    dVar131 = local_e50[lVar76].m_data[1];
    auVar135._8_8_ = 0;
    auVar135._0_8_ = local_e50[lVar76].m_data[2];
    auVar19._8_8_ = 0;
    auVar19._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar142._8_8_ = 0;
    auVar142._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
    auVar87 = vfmadd231sd_fma(auVar142,auVar102,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar87 = vfmadd231sd_fma(auVar87,auVar135,auVar20);
    dVar187 = local_bf0[lVar76].m_data[2];
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar149._8_8_ = 0;
    auVar149._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
    auVar88 = vfmadd231sd_fma(auVar149,auVar102,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar88 = vfmadd231sd_fma(auVar88,auVar135,auVar22);
    dVar3 = local_bf0[lVar76].m_data[1];
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar120._8_8_ = 0;
    auVar120._0_8_ =
         dVar131 * (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
    auVar89 = vfmadd231sd_fma(auVar120,auVar102,auVar23);
    local_1270._0_8_ = pCVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         (pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar89 = vfmadd231sd_fma(auVar89,auVar135,auVar24);
    local_10a8[lVar76].m_data[0] = auVar89._0_8_ - local_bf0[lVar76].m_data[0];
    local_10a8[lVar76].m_data[1] = auVar88._0_8_ - dVar3;
    local_10a8[lVar76].m_data[2] = auVar87._0_8_ - dVar187;
    local_380[0] = 0.0;
    local_380[3] = pCVar65[lVar76].m_data[2];
    auVar121._0_8_ = (ulong)local_380[3] ^ local_ca0;
    auVar121._8_8_ = uStack_c98;
    local_380[1] = (double)vmovlpd_avx(auVar121);
    local_380[2] = pCVar65[lVar76].m_data[1];
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_380[2];
    local_380[4] = 0.0;
    adStack_348[0] = pCVar65[lVar76].m_data[0];
    auVar103._8_8_ = 0;
    auVar103._0_8_ = adStack_348[0];
    auVar87 = vunpcklpd_avx(auVar103,auVar122);
    auStack_358[0] = auVar87._0_8_ ^ local_ca0;
    auStack_358[1] = auVar87._8_8_ ^ uStack_c98;
    adStack_348[1] = 0.0;
    local_680[0] = 0.0;
    local_680[3] = local_f70[lVar76].m_data[2];
    auVar123._0_8_ = (ulong)local_680[3] ^ local_ca0;
    auVar123._8_8_ = uStack_c98;
    local_680[1] = (double)vmovlpd_avx(auVar123);
    local_680[2] = local_f70[lVar76].m_data[1];
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_680[2];
    local_680[4] = 0.0;
    adStack_648[0] = local_f70[lVar76].m_data[0];
    auVar104._8_8_ = 0;
    auVar104._0_8_ = adStack_648[0];
    auVar87 = vunpcklpd_avx(auVar104,auVar124);
    auStack_658[0] = auVar87._0_8_ ^ local_ca0;
    auStack_658[1] = auVar87._8_8_ ^ uStack_c98;
    adStack_648[1] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = local_e48[lVar76].m_data[2];
    auVar125._0_8_ =
         (ulong)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[3] ^ local_ca0;
    auVar125._8_8_ = uStack_c98;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar125);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = local_e48[lVar76].m_data[1];
    auVar126._8_8_ = 0;
    auVar126._0_8_ =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = local_e48[lVar76].m_data[0];
    auVar105._8_8_ = 0;
    auVar105._0_8_ =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar87 = vunpcklpd_avx(auVar105,auVar126);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = (double)(auVar87._0_8_ ^ local_ca0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = (double)(auVar87._8_8_ ^ uStack_c98);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_e50[lVar76].m_data[2];
    auVar127._0_8_ =
         (ulong)local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3] ^ local_ca0;
    auVar127._8_8_ = uStack_c98;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar127);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_e50[lVar76].m_data[1];
    auVar128._8_8_ = 0;
    auVar128._0_8_ =
         local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_e50[lVar76].m_data[0];
    auVar106._8_8_ = 0;
    auVar106._0_8_ =
         local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar87 = vunpcklpd_avx(auVar106,auVar128);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)(auVar87._0_8_ ^ local_ca0);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)(auVar87._8_8_ ^ uStack_c98);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    local_f48 = &xi_i + lVar76 * 2;
    local_11d0._32_8_ = local_f78 + lVar76;
    local_1160._0_8_ = local_bf8 + lVar76;
    local_ec0 = local_e10;
    local_1360._0_8_ = local_e08;
    local_1170._0_8_ = local_10d0;
    local_1340._0_8_ = local_e20;
    local_1090._0_8_ = local_10c8;
    local_1368 = local_10c0;
    local_1328 = local_10b8;
    lVar80 = 0;
    pdVar62 = local_e18;
    pdVar66 = local_10b0;
    local_bc8 = lVar76;
    do {
      paCVar60 = local_f50;
      pvVar56 = local_1188;
      local_1200._0_8_ = lVar80;
      local_1210._0_8_ = (long)local_1188 * 0x20;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = (double)(*(code *)(&LI)[lVar80])(local_f48);
      pdVar73 = (*paCVar60)[lVar80].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + (long)pvVar56 * 4;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar73[1];
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar73;
      pdVar73 = (*paCVar60)[lVar80].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + (long)pvVar56 * 4 + 2;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [2] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar73;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [3] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar73[1];
      pdVar73 = (*paCVar60)[lVar80].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + (long)pvVar56 * 4 + 4;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [4] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar73;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [5] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar73[1];
      pdVar73 = (*paCVar60)[lVar80].super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                + (long)pvVar56 * 4 + 6;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [6] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar73;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [7] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar73[1];
      local_1150._0_8_ = lVar80 * 9;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] *
            (*paCVar60)[lVar80].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(long)pvVar56 * 4 + 8];
      uVar5 = local_1200._0_8_;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           (pCVar74->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.
           array[local_1200._0_8_ * 2];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)local_1270._0_8_;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 8);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x10);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x18);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x20);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x28);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x30);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x38);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x40);
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = &local_1320.super_Matrix<double,_3,_3,_1,_3,_3>;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startCol.m_value = local_1200._0_8_ * 6;
      pdVar73 = (((PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_> *)local_11d0._32_8_)->
                m_storage).m_data.array + local_1200._0_8_ * 6;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)local_11d0._32_8_;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startRow.m_value = 0;
      local_11a0._0_8_ =
           local_b00.
           super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
           m_startCol.m_value;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_outerStride = 0x18;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = pdVar73;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                (&local_b00,(Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1258);
      if (((undefined1 *)
           local_b00.
           super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
           m_rows.m_value != (undefined1 *)0x3) ||
         ((Matrix<double,_3,_3,_1,_3,_3> *)
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_cols.m_value != (Matrix<double,_3,_3,_1,_3,_3> *)0x3)) {
LAB_007aae91:
        __function = 
        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 12, 24, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 12, 24, 1>>]"
        ;
        goto LAB_007aaea6;
      }
      lVar76 = 0;
      LVar67.m_matrix = local_1258.m_lhs.m_lhs.m_lhs.m_matrix;
      do {
        lVar80 = 0;
        pdVar75 = (double *)LVar67.m_matrix;
        do {
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_data[lVar80] = *pdVar75;
          lVar80 = lVar80 + 1;
          pdVar75 = pdVar75 + 3;
        } while (lVar80 != 3);
        lVar76 = lVar76 + 1;
        LVar67.m_matrix = (non_const_type)((long)LVar67.m_matrix + 8);
        local_b00.
        super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
        m_data = local_b00.
                 super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                 .m_data + 0x18;
      } while (lVar76 != 3);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)local_1270._0_8_;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)local_380;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)&local_f40;
      local_1278 = pdVar73;
      local_1178 = pdVar62;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1320;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      local_1180 = (void *)(local_11a0._0_8_ + 3);
      uVar85 = local_11d0._32_8_ + 0x18 + local_11a0._0_8_ * 8;
      iVar70 = (int)uVar85;
      uVar85 = (ulong)(-((uint)(uVar85 >> 3) & 0x1fffffff) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(pdVar66 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(pdVar66 + uVar85 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           (pCVar74->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.
           array[uVar5 * 2 + 1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)local_1270._0_8_;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 8);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x10);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x18);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x20);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x28);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x30);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x38);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
           *(double *)(local_1270._0_8_ + 0x40);
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = &local_1320.super_Matrix<double,_3,_3,_1,_3,_3>;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = local_1278 + 0x48;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)local_11d0._32_8_;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startRow.m_value = 3;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_startCol.m_value = local_11a0._0_8_;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      m_outerStride = 0x18;
      Eigen::internal::
      check_for_aliasing<Eigen::Block<Eigen::Matrix<double,12,24,1,12,24>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
                (&local_b00,(Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1258);
      if (((undefined1 *)
           local_b00.
           super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
           m_rows.m_value != (undefined1 *)0x3) ||
         ((Matrix<double,_3,_3,_1,_3,_3> *)
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_cols.m_value != (Matrix<double,_3,_3,_1,_3,_3> *)0x3)) goto LAB_007aae91;
      lVar76 = 0;
      LVar67.m_matrix = local_1258.m_lhs.m_lhs.m_lhs.m_matrix;
      do {
        lVar80 = 0;
        pdVar62 = (double *)LVar67.m_matrix;
        do {
          local_b00.
          super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
          super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
          m_data[lVar80] = *pdVar62;
          lVar80 = lVar80 + 1;
          pdVar62 = pdVar62 + 3;
        } while (lVar80 != 3);
        lVar76 = lVar76 + 1;
        LVar67.m_matrix = (non_const_type)((long)LVar67.m_matrix + 8);
        local_b00.
        super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.
        m_data = local_b00.
                 super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                 .m_data + 0x18;
      } while (lVar76 != 3);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)local_1270._0_8_;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)local_680;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)&local_f40;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1320;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      uVar85 = (ulong)(-(iVar70 + 0x240U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(local_1328 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(local_1328 + uVar85 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
          auVar94 = _local_12c0;
        }
        else {
          uVar85 = 3;
          auVar94 = _local_12c0;
        }
        lVar76 = lVar76 + 0x18;
        _local_12c0 = auVar94;
      } while (lVar76 != 0x48);
      local_12c0 = ZEXT816(0);
      auStack_12a8 = auVar94._24_40_;
      vStack_12b0.m_value = 0;
      local_1120.m_functor = (assign_op<double,_double> *)0x0;
      local_1120.m_dst = (DstEvaluatorType *)0x0;
      local_1120.m_src = (SrcEvaluatorType *)0x0;
      InterpDeriv(local_f58,pCVar74,(ChVector<double> *)local_12c0,(ChVector<double> *)&local_1120);
      local_1278 = (double *)
                   ((long)(*local_f60)[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array + local_1150._0_8_ * 8 + local_1210._0_8_);
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_1270._0_8_;
      local_1258.m_lhs.m_lhs.m_rhs = &local_1080;
      local_1258.m_lhs.m_rhs = &local_f40;
      local_1258.m_rhs.m_lhs.m_matrix = (non_const_type)local_1270._0_8_;
      local_1258.m_rhs.m_rhs = (RhsNested)local_1278;
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)&local_b00,&local_1258,
                 (assign_op<double,_double> *)&local_d00);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_data;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_rows.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_cols.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_xpr;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startRow.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startCol.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_outerStride;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           dStack_ac8;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_ac0;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1320;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 local_b00.
                 super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                 .m_data,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                          *)&local_b00);
      uVar85 = (ulong)(-(iVar70 + 0x480U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(local_1368 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(local_1368 + uVar85 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_1258.m_rhs.m_rhs =
           (RhsNested)
           ((long)(((DenseStorage<double,_9,_3,_3,_1> *)
                   (local_f68->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).
                   m_storage.m_data.array)->m_data).array + local_1150._0_8_ * 8 + local_1210._0_8_)
      ;
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_1270._0_8_;
      local_1258.m_lhs.m_lhs.m_rhs = &local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>;
      local_1258.m_lhs.m_rhs = &local_f40;
      local_1258.m_rhs.m_lhs.m_matrix = (non_const_type)local_1270._0_8_;
      local_1210._0_8_ = local_1258.m_rhs.m_rhs;
      Eigen::internal::
      assignment_from_xpr_op_product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::add_assign_op<double,double>>
      ::
      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,_3,_3,_1,_3,_3> *)&local_b00,&local_1258,
                 (assign_op<double,_double> *)&local_d00);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_data;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_rows.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                   .
                   super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                   .m_cols.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_xpr;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startRow.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_startCol.m_value;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           (double)local_b00.
                   super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                   .m_outerStride;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           dStack_ac8;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_ac0;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_1320;
      ChMatrix33<double>::operator=
                ((ChMatrix33<double> *)
                 local_b00.
                 super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>
                 .m_data,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                          *)&local_b00);
      uVar85 = (ulong)(-(iVar70 + 0x6c0U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      uVar57 = local_1090._0_8_;
      do {
        if (uVar85 != 0) {
          memcpy((void *)(uVar57 + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy((void *)(uVar57 + uVar85 * 8 + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (pCVar74->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.
           array[uVar5 * 2];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
           0.0;
      uVar85 = local_1160._0_8_ + local_11a0._0_8_ * 8;
      uVar86 = (ulong)(-((uint)(uVar85 >> 3) & 0x1fffffff) & 7);
      if (2 < uVar86) {
        uVar86 = 3;
      }
      lVar76 = 0;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      do {
        if (uVar86 != 0) {
          memcpy((void *)(local_1340._0_8_ + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar86 * 8);
        }
        if (uVar86 < 3) {
          memcpy((void *)(local_1340._0_8_ + uVar86 * 8 + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar86 * 8),uVar86 * -8 + 0x18);
        }
        else {
          uVar86 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           (pCVar74->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.
           array[uVar5 * 2 + 1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
           0.0;
      uVar85 = (ulong)(-((int)uVar85 + 0x240U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      uVar57 = local_1170._0_8_;
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      do {
        if (uVar85 != 0) {
          memcpy((void *)(uVar57 + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy((void *)(uVar57 + uVar85 * 8 + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = local_1278;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      iVar70 = local_1160._0_4_ + (int)local_1180 * 8;
      uVar85 = (ulong)(-(iVar70 + 0x480U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      do {
        if (uVar85 != 0) {
          memcpy((void *)(local_1360._0_8_ + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy((void *)(local_1360._0_8_ + uVar85 * 8 + lVar76 * 8),
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)local_1210._0_8_;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      uVar85 = (ulong)(-(iVar70 + 0x6c0U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(local_ec0 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(local_ec0 + uVar85 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_rows
      .m_value = (long)&((this->m_nodes).
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar5].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->field_0x58;
      local_b00.
      super_BlockImpl<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_24,_1,_12,_24>,__1,__1,_false>,_0>.m_data
           = (PointerType)&local_f40;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_b00);
      pdVar62 = local_1178;
      uVar85 = (ulong)(-(iVar70 + 0x900U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar76 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(pdVar62 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(pdVar62 + uVar85 + lVar76,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar76 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar76 = lVar76 + 0x18;
      } while (lVar76 != 0x48);
      lVar80 = local_1200._0_8_ + 1;
      pdVar66 = pdVar66 + 6;
      local_1328 = local_1328 + 6;
      local_1368 = local_1368 + 6;
      local_1090._0_8_ = local_1090._0_8_ + 0x30;
      local_1340._0_8_ = local_1340._0_8_ + 0x30;
      local_1170._0_8_ = local_1170._0_8_ + 0x30;
      local_1360._0_8_ = local_1360._0_8_ + 0x30;
      local_ec0 = local_ec0 + 6;
      pdVar62 = pdVar62 + 6;
    } while (lVar80 != 4);
    lVar76 = local_bc8 + 1;
    pdVar62 = local_10b0 + 0x120;
    pdVar66 = local_10b8 + 0x120;
    pdVar73 = local_10c0 + 0x120;
    pdVar75 = local_10c8 + 0x120;
    pCVar84 = local_e20 + 1;
    pCVar77 = (ChMatrixNM<double,_15,_15> *)
              (local_10d0[1].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
               m_storage.m_data.array + 0x87);
    pdVar79 = local_e08 + 0x168;
    pdVar82 = local_e10 + 0x168;
    pdVar83 = local_e18 + 0x168;
  } while (lVar76 != 4);
  local_c10.m_data[2] = 0.0;
  local_c10.m_data[0] = 0.0;
  local_c10.m_data[1] = 0.0;
  local_c30.m_data[2] = 0.0;
  local_c30.m_data[0] = 0.0;
  local_c30.m_data[1] = 0.0;
  local_11a0._0_8_ = this->L_alpha_beta_A;
  local_11d0._32_8_ = this->T_A;
  local_1210._0_8_ = this->eps_tilde_1_A;
  local_1150._0_8_ = this->eps_tilde_1_0_A;
  local_1160._0_8_ = this->eps_tilde_2_A;
  local_1170._0_8_ = this->eps_tilde_2_0_A;
  local_1270._0_8_ = this->Phi_Delta_A;
  lVar76 = 0;
  do {
    __s = (Index *)&local_b00;
    memset(__s,0,0x480);
    local_1200._0_8_ = lVar76 * 0x40;
    pCVar74 = (ChMatrixNM<double,_4,_2> *)(local_11a0._0_8_ + lVar76 * 0x40);
    InterpDeriv(local_e28,pCVar74,&local_c10,&local_c30);
    local_ec0 = (double *)(local_11d0._32_8_ + lVar76 * 0x48);
    auVar107._8_8_ = 0;
    auVar107._0_8_ = local_c10.m_data[0];
    auVar136._8_8_ = 0;
    auVar136._0_8_ = local_c10.m_data[2];
    lVar80 = lVar76 * 0x18;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_ec0[2];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = local_c10.m_data[1] * local_ec0[5];
    auVar87 = vfmadd231sd_fma(auVar143,auVar107,auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = local_ec0[8];
    auVar87 = vfmadd231sd_fma(auVar87,auVar136,auVar26);
    dVar131 = *(double *)(local_1150._0_8_ + 0x10 + lVar80);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_ec0[1];
    auVar150._8_8_ = 0;
    auVar150._0_8_ = local_c10.m_data[1] * local_ec0[4];
    auVar88 = vfmadd231sd_fma(auVar150,auVar107,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_ec0[7];
    auVar88 = vfmadd231sd_fma(auVar88,auVar136,auVar28);
    dVar187 = *(double *)(local_1150._0_8_ + 8 + lVar80);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *local_ec0;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = local_c10.m_data[1] * local_ec0[3];
    auVar89 = vfmadd231sd_fma(auVar152,auVar107,auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_ec0[6];
    auVar89 = vfmadd231sd_fma(auVar89,auVar136,auVar30);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = (double)(local_ca0 ^ (ulong)local_c10.m_data[0]);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = (double)(uStack_c98 ^ (ulong)local_c10.m_data[1]);
    *(double *)(local_1210._0_8_ + lVar80) = auVar89._0_8_ - *(double *)(local_1150._0_8_ + lVar80);
    *(double *)(local_1210._0_8_ + 8 + lVar80) = auVar88._0_8_ - dVar187;
    *(double *)(local_1210._0_8_ + 0x10 + lVar80) = auVar87._0_8_ - dVar131;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = local_c30.m_data[0];
    auVar153._8_8_ = 0;
    auVar153._0_8_ = local_c30.m_data[2];
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_ec0[2];
    auVar161._8_8_ = 0;
    auVar161._0_8_ = local_c30.m_data[1] * local_ec0[5];
    auVar87 = vfmadd231sd_fma(auVar161,auVar144,auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_ec0[8];
    auVar87 = vfmadd231sd_fma(auVar87,auVar153,auVar32);
    dVar131 = *(double *)(local_1170._0_8_ + 0x10 + lVar80);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_ec0[1];
    auVar169._8_8_ = 0;
    auVar169._0_8_ = local_c30.m_data[1] * local_ec0[4];
    auVar88 = vfmadd231sd_fma(auVar169,auVar144,auVar33);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_ec0[7];
    auVar88 = vfmadd231sd_fma(auVar88,auVar153,auVar34);
    dVar187 = *(double *)(local_1170._0_8_ + 8 + lVar80);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *local_ec0;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = local_c30.m_data[1] * local_ec0[3];
    auVar89 = vfmadd231sd_fma(auVar177,auVar144,auVar35);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_ec0[6];
    auVar89 = vfmadd231sd_fma(auVar89,auVar153,auVar36);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)(local_ca0 ^ (ulong)local_c30.m_data[0]);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)(uStack_c98 ^ (ulong)local_c30.m_data[1]);
    *(double *)(local_1160._0_8_ + lVar80) = auVar89._0_8_ - *(double *)(local_1170._0_8_ + lVar80);
    *(double *)(local_1160._0_8_ + 8 + lVar80) = auVar88._0_8_ - dVar187;
    *(double *)(local_1160._0_8_ + 0x10 + lVar80) = auVar87._0_8_ - dVar131;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    auVar162._0_8_ = local_ca0 ^ (ulong)local_c10.m_data[2];
    auVar162._8_8_ = uStack_c98;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar162);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = local_c10.m_data[1];
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = local_c10.m_data[2];
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = local_c10.m_data[0];
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    auVar108._0_8_ = local_ca0 ^ (ulong)local_c30.m_data[2];
    auVar108._8_8_ = uStack_c98;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar108);
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_c30.m_data[1];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_c30.m_data[2];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_c30.m_data[0];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    lVar80 = 0;
    do {
      lVar71 = lVar76 * 0x120 + local_1270._0_8_;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = (double)(*(code *)(&LI)[lVar80])(xi_A + lVar76 * 0x10);
      pdVar62 = (double *)(lVar71 + lVar80 * 0x48);
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [1] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar62[1];
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [0] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar62;
      pdVar62 = (double *)(lVar71 + 0x10 + lVar80 * 0x48);
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [2] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar62;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [3] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar62[1];
      pdVar62 = (double *)(lVar71 + 0x20 + lVar80 * 0x48);
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [4] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar62;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [5] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar62[1];
      pdVar62 = (double *)(lVar71 + 0x30 + lVar80 * 0x48);
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [6] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *pdVar62;
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [7] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * pdVar62[1];
      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
      [8] = local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[8] * *(double *)(lVar71 + 0x40 + lVar80 * 0x48);
      local_1258.m_lhs.m_rhs =
           (RhsNested)
           (pCVar74->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.
           array[lVar80 * 2];
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_ec0;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)&local_1258);
      iVar70 = (int)(lVar80 * 0x30);
      uVar85 = (ulong)(-((uint)((ulong)(lVar80 * 0x30) >> 3) & 0x1fffffff) & 6);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar71 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(__s + lVar71,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(__s + uVar85 + lVar71,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar71 = lVar71 + 0x18;
      } while (lVar71 != 0x48);
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_ec0;
      local_1258.m_lhs.m_lhs.m_rhs = &local_1080;
      local_1258.m_lhs.m_rhs = &local_f40;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_1258);
      local_1258.m_lhs.m_lhs.m_rhs =
           (RhsNested)
           &((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar80].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            field_0x58;
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = &local_1320.super_Matrix<double,_3,_3,_1,_3,_3>;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_1258);
      uVar85 = (ulong)(-(iVar70 + 0x18U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar71 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(__s + lVar71 + 3,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(__s + uVar85 + lVar71 + 3,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar71 = lVar71 + 0x18;
      } while (lVar71 != 0x48);
      local_1258.m_lhs.m_rhs =
           (RhsNested)
           (pCVar74->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.
           array[lVar80 * 2 + 1];
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_ec0;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                  *)&local_1258);
      uVar85 = (ulong)(-(iVar70 + 0x240U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar71 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(__s + lVar71 + 0x48,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(__s + uVar85 + lVar71 + 0x48,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar71 = lVar71 + 0x18;
      } while (lVar71 != 0x48);
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)local_ec0;
      local_1258.m_lhs.m_lhs.m_rhs = &local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>;
      local_1258.m_lhs.m_rhs = &local_f40;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_1258);
      local_1258.m_lhs.m_lhs.m_rhs =
           (RhsNested)
           &((this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar80].
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            field_0x58;
      local_1258.m_lhs.m_lhs.m_lhs.m_matrix = &local_1320.super_Matrix<double,_3,_3,_1,_3,_3>;
      ChMatrix33<double>::operator=
                (&local_1320,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                  *)&local_1258);
      uVar85 = (ulong)(-(iVar70 + 600U >> 3) & 7);
      if (2 < uVar85) {
        uVar85 = 3;
      }
      lVar71 = 0;
      do {
        if (uVar85 != 0) {
          memcpy(__s + lVar71 + 0x4b,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71),uVar85 * 8);
        }
        if (uVar85 < 3) {
          memcpy(__s + uVar85 + lVar71 + 0x4b,
                 (void *)((long)local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + lVar71 + uVar85 * 8),uVar85 * -8 + 0x18);
        }
        else {
          uVar85 = 3;
        }
        lVar71 = lVar71 + 0x18;
      } while (lVar71 != 0x48);
      lVar80 = lVar80 + 1;
      __s = __s + 6;
    } while (lVar80 != 4);
    lVar80 = local_1200._0_8_ * 3;
    *(undefined8 *)((long)local_380 + lVar80) = local_980;
    *(undefined8 *)((long)local_380 + lVar80 + 8) = uStack_978;
    *(undefined8 *)((long)local_380 + lVar80 + 0x10) = uStack_970;
    *(undefined8 *)((long)auStack_358 + lVar80 + -0x10) = uStack_968;
    *(undefined8 *)((long)auStack_358 + lVar80 + -8) = uStack_960;
    *(undefined8 *)((long)auStack_358 + lVar80) = uStack_958;
    *(undefined8 *)((long)auStack_358 + lVar80 + 8) = uStack_950;
    *(undefined8 *)((long)auStack_358 + lVar80 + 0x10) = uStack_948;
    *(undefined8 *)(auStack_338 + lVar80 + -8) = local_940;
    *(undefined8 *)(auStack_338 + lVar80) = uStack_938;
    *(undefined8 *)(auStack_338 + lVar80 + 8) = uStack_930;
    *(undefined8 *)(auStack_338 + lVar80 + 0x10) = uStack_928;
    *(undefined8 *)(auStack_338 + lVar80 + 0x18) = uStack_920;
    *(undefined8 *)(local_300 + lVar80 + -0x18) = uStack_918;
    *(undefined8 *)(local_300 + lVar80 + -0x10) = uStack_910;
    *(undefined8 *)(local_300 + lVar80 + -8) = uStack_908;
    *(undefined8 *)(local_300 + lVar80) = local_900;
    *(undefined8 *)(local_300 + lVar80 + 8) = uStack_8f8;
    *(undefined8 *)(local_300 + lVar80 + 0x10) = uStack_8f0;
    *(undefined8 *)(local_300 + lVar80 + 0x18) = uStack_8e8;
    *(undefined8 *)(local_300 + lVar80 + 0x20) = uStack_8e0;
    *(undefined8 *)(local_2c0 + lVar80 + -0x18) = uStack_8d8;
    *(undefined8 *)(local_2c0 + lVar80 + -0x10) = uStack_8d0;
    *(undefined8 *)(local_2c0 + lVar80 + -8) = uStack_8c8;
    *(undefined8 *)((long)local_680 + lVar80) = local_740;
    *(undefined8 *)((long)local_680 + lVar80 + 8) = uStack_738;
    *(undefined8 *)((long)local_680 + lVar80 + 0x10) = uStack_730;
    *(undefined8 *)((long)auStack_658 + lVar80 + -0x10) = uStack_728;
    *(undefined8 *)((long)auStack_658 + lVar80 + -8) = uStack_720;
    *(undefined8 *)((long)auStack_658 + lVar80) = uStack_718;
    *(undefined8 *)((long)auStack_658 + lVar80 + 8) = uStack_710;
    *(undefined8 *)((long)auStack_658 + lVar80 + 0x10) = uStack_708;
    *(undefined8 *)(auStack_638 + lVar80 + -8) = local_700;
    *(undefined8 *)(auStack_638 + lVar80) = uStack_6f8;
    *(undefined8 *)(auStack_638 + lVar80 + 8) = uStack_6f0;
    *(undefined8 *)(auStack_638 + lVar80 + 0x10) = uStack_6e8;
    *(undefined8 *)(auStack_638 + lVar80 + 0x18) = uStack_6e0;
    *(undefined8 *)(local_600 + lVar80 + -0x18) = uStack_6d8;
    *(undefined8 *)(local_600 + lVar80 + -0x10) = uStack_6d0;
    *(undefined8 *)(local_600 + lVar80 + -8) = uStack_6c8;
    *(undefined8 *)(local_600 + lVar80) = local_6c0;
    *(undefined8 *)(local_600 + lVar80 + 8) = uStack_6b8;
    *(undefined8 *)(local_600 + lVar80 + 0x10) = uStack_6b0;
    *(undefined8 *)(local_600 + lVar80 + 0x18) = uStack_6a8;
    *(undefined8 *)(local_600 + lVar80 + 0x20) = uStack_6a0;
    *(undefined8 *)(local_5c0 + lVar80 + -0x18) = uStack_698;
    *(undefined8 *)(local_5c0 + lVar80 + -0x10) = uStack_690;
    *(undefined8 *)(local_5c0 + lVar80 + -8) = uStack_688;
    lVar76 = lVar76 + 1;
  } while (lVar76 != 4);
  local_ec0 = local_c0;
  uStack_eb8 = uStack_b8;
  uStack_eb0 = uStack_b0;
  uStack_ea8 = uStack_a8;
  uStack_ea0 = uStack_a0;
  uStack_e98 = uStack_98;
  uStack_e90 = uStack_90;
  uStack_e88 = uStack_88;
  auVar49._8_8_ = local_380[1];
  auVar49._0_8_ = local_380[0];
  auVar49._16_8_ = local_380[2];
  auVar49._24_8_ = local_380[3];
  auVar49._32_8_ = local_380[4];
  auVar49._40_8_ = auStack_358[0];
  auVar49._48_8_ = auStack_358[1];
  auVar49._56_8_ = adStack_348[0];
  auVar50._8_56_ = auStack_338;
  auVar50._0_8_ = adStack_348[1];
  auVar87 = vxorpd_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar189 = ZEXT1664(auVar87);
  auVar92 = vmulpd_avx512f(auVar189,local_600);
  auVar93._8_56_ = auStack_638;
  auVar93._0_8_ = adStack_648[1];
  auVar93 = vmulpd_avx512f(auVar189,auVar93);
  auVar94._8_8_ = local_680[1];
  auVar94._0_8_ = local_680[0];
  auVar94._16_8_ = local_680[2];
  auVar94._24_8_ = local_680[3];
  auVar94._32_8_ = local_680[4];
  auVar94._40_8_ = auStack_658[0];
  auVar94._48_8_ = auStack_658[1];
  auVar94._56_8_ = adStack_648[0];
  auVar94 = vmulpd_avx512f(auVar189,auVar94);
  puVar68 = &DAT_00b92d68;
  pdVar62 = this->B_overline_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_24,_1,_12,_24>_>.
            m_storage.m_data.array + 0x88;
  lVar76 = 18000;
  do {
    auVar191._8_8_ = 0;
    auVar191._0_8_ = *puVar68;
    auVar87 = vaddsd_avx512f(auVar191,ZEXT816(0x3ff0000000000000));
    auVar87 = vmulsd_avx512f(auVar87,ZEXT816(0x3fe0000000000000));
    auVar88 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar191);
    auVar88 = vmulsd_avx512f(auVar88,ZEXT816(0x3fe0000000000000));
    auVar190._8_8_ = 0;
    auVar190._0_8_ = puVar68[-1];
    auVar89 = vsubsd_avx512f(ZEXT816(0x3ff0000000000000),auVar190);
    auVar89 = vmulsd_avx512f(auVar89,ZEXT816(0x3fe0000000000000));
    auVar90 = vaddsd_avx512f(auVar190,ZEXT816(0x3ff0000000000000));
    auVar90 = vmulsd_avx512f(auVar90,ZEXT816(0x3fe0000000000000));
    auVar37._8_8_ = 0;
    auVar37._0_8_ = this->eps_tilde_1_A[2].m_data[2];
    auVar91 = vmulsd_avx512f(auVar88,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = this->eps_tilde_1_A[0].m_data[2];
    auVar91 = vfmadd231sd_avx512f(auVar91,auVar87,auVar38);
    puVar2 = (undefined8 *)
             ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                     _vptr_ChElementBase + lVar76);
    vmovsd_avx512f(auVar91);
    *puVar2 = *puVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = this->eps_tilde_2_A[3].m_data[2];
    auVar91 = vmulsd_avx512f(auVar90,auVar39);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = this->eps_tilde_2_A[1].m_data[2];
    auVar91 = vfmadd231sd_avx512f(auVar91,auVar89,auVar40);
    puVar2 = (undefined8 *)
             ((long)(this->m_MassMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar76 + -0x60);
    vmovsd_avx512f(auVar91);
    *puVar2 = *puVar2;
    auVar95 = vbroadcastsd_avx512f(auVar88);
    auVar96 = vbroadcastsd_avx512f(auVar87);
    auVar97 = vmulpd_avx512f(auVar96,local_300);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_240,auVar189);
    auVar97 = vfmadd231pd_avx512f(auVar97,auVar95,local_180);
    auVar98 = vmulpd_avx512f(auVar96,auVar50);
    auVar98 = vfmadd231pd_avx512f(auVar98,local_280,auVar189);
    auVar98 = vfmadd231pd_avx512f(auVar98,auVar95,local_1c0);
    auVar96 = vmulpd_avx512f(auVar96,auVar49);
    auVar96 = vfmadd231pd_avx512f(auVar96,local_2c0,auVar189);
    auVar95 = vfmadd231pd_avx512f(auVar96,local_200,auVar95);
    auVar95 = vfmadd231pd_avx512f(auVar95,local_140,auVar189);
    *(undefined1 (*) [64])(pdVar62 + -0x58) = auVar95;
    auVar95._8_8_ = uStack_b8;
    auVar95._0_8_ = local_c0;
    auVar95._16_8_ = uStack_b0;
    auVar95._24_8_ = uStack_a8;
    auVar95._32_8_ = uStack_a0;
    auVar95._40_8_ = uStack_98;
    auVar95._48_8_ = uStack_90;
    auVar95._56_8_ = uStack_88;
    auVar95 = vfmadd231pd_avx512f(auVar97,auVar189,auVar95);
    auVar96 = vfmadd231pd_avx512f(auVar98,local_100,auVar189);
    *(undefined1 (*) [64])(pdVar62 + -0x50) = auVar96;
    *(undefined1 (*) [64])(pdVar62 + -0x48) = auVar95;
    auVar95 = vbroadcastsd_avx512f(auVar90);
    auVar96 = vbroadcastsd_avx512f(auVar89);
    auVar97 = vfmadd213pd_avx512f(local_540,auVar96,auVar92);
    auVar97 = vfmadd231pd_avx512f(auVar97,local_480,auVar189);
    auVar97 = vfmadd231pd_avx512f(auVar97,auVar95,local_3c0);
    auVar98 = vfmadd213pd_avx512f(local_580,auVar96,auVar93);
    auVar98 = vfmadd231pd_avx512f(auVar98,local_4c0,auVar189);
    auVar98 = vfmadd231pd_avx512f(auVar98,auVar95,local_400);
    auVar96 = vfmadd213pd_avx512f(auVar96,local_5c0,auVar94);
    auVar96 = vfmadd231pd_avx512f(auVar96,local_500,auVar189);
    auVar95 = vfmadd231pd_avx512f(auVar96,local_440,auVar95);
    *(undefined1 (*) [64])(pdVar62 + -0x10) = auVar95;
    *(undefined1 (*) [64])(pdVar62 + -8) = auVar98;
    *(undefined1 (*) [64])pdVar62 = auVar97;
    pdVar62 = pdVar62 + 0x120;
    puVar68 = puVar68 + 2;
    lVar76 = lVar76 + 0x18;
  } while (lVar76 != 0x46b0);
  local_f68 = &this->epsilon;
  pdVar62 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage
            .m_data.array + 3;
  local_10b0 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
               m_storage.m_data.array + 6;
  local_10b8 = (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
               m_storage.m_data.array + 9;
  local_10d0 = this->G_i;
  local_10c0 = this->stress_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
               m_storage.m_data.array + 6;
  local_10c8 = this->stress_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
               m_storage.m_data.array + 3;
  pdVar66 = this->eps_tilde_2_i[0].m_data + 1;
  lVar76 = 0;
  pCVar65 = local_10a0;
  pCVar69 = local_10a8;
  pCVar72 = local_1098;
  do {
    pCVar59 = local_f68;
    uVar85 = lVar76 * 0x60;
    uVar78 = -((int)uVar85 + 0x30U >> 3) & 6;
    if (2 < uVar78) {
      uVar78 = 3;
    }
    uVar86 = CONCAT44(0,uVar78 << 3);
    local_11a0._0_8_ = local_10c0 + lVar76 * 0xc;
    local_1090._0_8_ = (long)(local_10c0 + lVar76 * 0xc) + uVar86;
    local_1278 = (double *)
                 ((long)&local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data +
                 uVar86);
    local_11d0._32_8_ = uVar86;
    local_1178 = (double *)(uVar86 ^ 0x18);
    uVar81 = (uint)(uVar85 >> 3);
    uVar78 = 5 - uVar81 & 5;
    if (2 < uVar78) {
      uVar78 = 3;
    }
    uVar86 = CONCAT44(0,uVar78 << 3);
    local_1210._0_8_ = local_10c8 + lVar76 * 0xc;
    local_1180 = (void *)((long)(local_10c8 + lVar76 * 0xc) + uVar86);
    local_1188 = (void *)((long)&local_11f0 + uVar86);
    local_1150._0_8_ = uVar86;
    local_f48 = (undefined8 *)(uVar86 ^ 0x18);
    uVar81 = uVar81 & 4;
    if (2 < uVar81) {
      uVar81 = 3;
    }
    uVar86 = CONCAT44(0,uVar81 << 3);
    local_f50 = (ChMatrix33<double> (*) [4])(uVar86 ^ 0x18);
    local_1200._0_8_ = uVar85;
    pPVar63 = &this->stress_i[lVar76].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
    ;
    local_1170._0_8_ = pPVar63;
    local_f58 = (ChVector<double> *)((long)(pPVar63->m_storage).m_data.array + uVar86);
    local_1160._0_8_ = uVar86;
    local_f60 = (ChMatrix33<double> (*) [4])(local_11d0 + uVar86);
    lVar80 = 0;
    do {
      (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
      m_data.array[lVar80] = pCVar72->m_data[lVar80];
      lVar80 = lVar80 + 1;
    } while (lVar80 != 3);
    local_1270._0_8_ = lVar76 * 3;
    *pdVar62 = local_e30[lVar76].m_data[0];
    lVar80 = 0;
    do {
      (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
      m_data.array[lVar80 + 4] = pdVar66[lVar80];
      lVar80 = lVar80 + 1;
    } while (lVar80 != 2);
    lVar80 = 0;
    do {
      (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
      m_data.array[lVar80 + 6] = pCVar65->m_data[lVar80];
      lVar80 = lVar80 + 1;
    } while (lVar80 != 3);
    lVar80 = 0;
    do {
      (this->epsilon).super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
      m_data.array[lVar80 + 9] = pCVar69->m_data[lVar80];
      lVar80 = lVar80 + 1;
    } while (lVar80 != 3);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)local_f68;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)local_f68;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_10a8 = pCVar69;
    local_10a0 = pCVar65;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_f90,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar59;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)pdVar62;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_fb0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)local_10b0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar59;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 2.96439387504748e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_de0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)local_10b8;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)pCVar59;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 4.44659081257122e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_e00,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_11d0._16_8_ = 0.0;
    local_11d0._0_8_ = 0.0;
    local_11d0._8_8_ = 0.0;
    local_11e0 = 0.0;
    local_11f0 = 0.0;
    dStack_11e8 = 0.0;
    local_1130 = 0.0;
    local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = (double *)0x0;
    local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 0;
    local_e60 = 0.0;
    local_e70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)0x0;
    local_e70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 0;
    local_c40 = 0.0;
    local_c50 = 0.0;
    dStack_c48 = 0.0;
    local_c60 = 0.0;
    local_c70 = 0.0;
    dStack_c68 = 0.0;
    local_c80 = 0.0;
    local_c90 = 0.0;
    dStack_c88 = 0.0;
    pLVar64 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar94 = ZEXT864(0) << 0x40;
    auVar184 = auVar94._0_16_;
    local_1098 = pCVar72;
    if ((this->m_layers).
        super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        ._M_impl.super__Vector_impl_data._M_finish == pLVar64) {
      dVar131 = 0.0;
      auVar185 = ZEXT816(0);
    }
    else {
      lVar80 = 0;
      dVar131 = 0.0;
      dVar187 = 0.0;
      uVar85 = 0;
      do {
        plVar41 = *(long **)((long)&(pLVar64->m_material).
                                    super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar80);
        p_Var42 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(pLVar64->m_material).
                           super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar80);
        if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
          }
        }
        local_ec0 = auVar94._0_8_;
        pdVar43 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (**(code **)(*plVar41 + 0x10))
                  (pdVar43[uVar85],pdVar43[uVar85 + 1],
                   *(undefined8 *)
                    ((long)&((this->m_layers).
                             super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_theta + lVar80),plVar41,
                   &local_e70,&local_c50,&local_c70,&local_c90,&local_f90,&local_fb0,&local_de0,
                   &local_e00,0,0);
        if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var42);
        }
        uVar85 = uVar85 + 1;
        local_11d0._0_8_ =
             (double)local_e70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data +
             (double)local_11d0._0_8_;
        local_11d0._8_8_ =
             (double)local_e70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride +
             (double)local_11d0._8_8_;
        local_11d0._16_8_ = local_e60 + (double)local_11d0._16_8_;
        local_11f0 = local_c50 + local_11f0;
        dStack_11e8 = dStack_c48 + dStack_11e8;
        local_11e0 = local_c40 + local_11e0;
        local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)
             (local_c70 +
             (double)local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data);
        local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride =
             (long)(dStack_c68 +
                   (double)local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride);
        local_1130 = local_c60 + local_1130;
        auVar94 = ZEXT864((ulong)((double)local_ec0 + local_c90));
        auVar184._8_8_ = 0;
        auVar184._0_8_ = (double)local_ec0 + local_c90;
        dVar131 = dVar131 + dStack_c88;
        dVar187 = dVar187 + local_c80;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = dVar187;
        pLVar64 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar80 = lVar80 + 0x28;
      } while (uVar85 < (ulong)(((long)(this->m_layers).
                                       super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar64 >>
                                3) * -0x3333333333333333));
    }
    pdVar73 = this->stress_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
              m_storage.m_data.array + local_1270._0_8_ * 4;
    iVar70 = (int)pdVar73;
    uVar78 = -((uint)((ulong)pdVar73 >> 3) & 0x1fffffff) & 7;
    local_ec0 = auVar184._0_8_;
    auVar186._0_8_ = auVar185._0_8_;
    if (uVar78 != 0) {
      memcpy((void *)local_1170._0_8_,local_11d0,local_1160._0_8_);
      auVar186._8_8_ = 0;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_ec0;
      auVar185 = auVar186;
    }
    if (uVar78 < 3) {
      memcpy(local_f58,local_f60,(size_t)local_f50);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = auVar186._0_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_ec0;
    }
    uVar78 = -(iVar70 + 0x18U >> 3) & 7;
    if (uVar78 != 0) {
      memcpy((void *)local_1210._0_8_,&local_11f0,local_1150._0_8_);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = auVar186._0_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_ec0;
    }
    if (uVar78 < 3) {
      memcpy(local_1180,local_1188,(size_t)local_f48);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = auVar186._0_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_ec0;
    }
    uVar78 = -(iVar70 + 0x30U >> 3) & 7;
    if (uVar78 != 0) {
      memcpy((void *)local_11a0._0_8_,&local_1140,local_11d0._32_8_);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = auVar186._0_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_ec0;
    }
    if (uVar78 < 3) {
      memcpy((void *)local_1090._0_8_,local_1278,(size_t)local_1178);
      auVar185._8_8_ = 0;
      auVar185._0_8_ = auVar186._0_8_;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = local_ec0;
    }
    if ((-(iVar70 + 0x48U >> 3) & 7) != 0) {
      *(long *)((long)this->stress_i[0].
                      super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                      m_data.array + local_1200._0_8_ + 0x48) = auVar184._0_8_;
      *(double *)
       ((long)this->stress_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.
              m_storage.m_data.array + local_1200._0_8_ + 0x50) = dVar131;
      *(long *)((long)this->stress_i[0].
                      super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
                      m_data.array + local_1200._0_8_ + 0x58) = auVar185._0_8_;
    }
    auVar156._8_8_ = 0;
    auVar156._0_8_ =
         local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    dVar187 = local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
    ;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = dVar187;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = local_11d0._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = local_11d0._8_8_;
    auVar188._8_8_ = 0;
    auVar188._0_8_ = (double)local_11d0._8_8_ * dVar187;
    auVar87 = vfmadd231sd_fma(auVar188,auVar156,auVar154);
    auVar178._8_8_ = 0;
    auVar178._0_8_ =
         local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar179._8_8_ = 0;
    auVar179._0_8_ = local_11d0._16_8_;
    local_1360 = vfmadd231sd_fma(auVar87,auVar178,auVar179);
    auVar109._8_8_ = 0;
    auVar109._0_8_ =
         local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    dVar3 = local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar129._8_8_ = 0;
    auVar129._0_8_ = dVar3;
    auVar87 = vmulsd_avx512f(auVar170,auVar129);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar109,auVar154);
    auVar137._8_8_ = 0;
    auVar137._0_8_ =
         local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar88 = vfmadd231sd_avx512f(auVar87,auVar137,auVar179);
    auVar145._8_8_ = 0;
    auVar145._0_8_ =
         local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    dVar4 = local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar151._8_8_ = 0;
    auVar151._0_8_ = dVar4;
    auVar87 = vmulsd_avx512f(auVar170,auVar151);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar145,auVar154);
    auVar155._8_8_ = 0;
    auVar155._0_8_ =
         local_e40[lVar76].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_1340 = vfmadd231sd_avx512f(auVar87,auVar155,auVar179);
    auVar171._8_8_ = 0;
    auVar171._0_8_ = local_11f0;
    auVar180._8_8_ = 0;
    auVar180._0_8_ = dStack_11e8;
    auVar87 = vmulsd_avx512f(auVar163,auVar180);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar156,auVar171);
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_11e0;
    local_1200 = vfmadd231sd_avx512f(auVar87,auVar178,auVar182);
    auVar87 = vmulsd_avx512f(auVar129,auVar180);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar109,auVar171);
    local_1270 = vfmadd231sd_avx512f(auVar87,auVar137,auVar182);
    auVar87 = vmulsd_avx512f(auVar151,auVar180);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar145,auVar171);
    local_11a0 = vfmadd231sd_avx512f(auVar87,auVar155,auVar182);
    auVar172._8_8_ = 0;
    auVar172._0_8_ = local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride;
    auVar87 = vmulsd_avx512f(auVar163,auVar181);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar156,auVar172);
    auVar183._8_8_ = 0;
    auVar183._0_8_ = local_1130;
    local_1210 = vfmadd231sd_avx512f(auVar87,auVar178,auVar183);
    auVar87 = vmulsd_avx512f(auVar129,auVar181);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar109,auVar172);
    register0x000008fc = vfmadd231sd_avx512f(auVar87,auVar137,auVar183);
    auVar87 = vmulsd_avx512f(auVar151,auVar181);
    auVar87 = vfmadd231sd_avx512f(auVar87,auVar145,auVar172);
    local_1150 = vfmadd231sd_avx512f(auVar87,auVar155,auVar183);
    auVar164._8_8_ = 0;
    auVar164._0_8_ = dVar131 * dVar187;
    auVar87 = vfmadd231sd_fma(auVar164,auVar184,auVar156);
    local_1170 = vfmadd231sd_fma(auVar87,auVar185,auVar178);
    auVar157._8_8_ = 0;
    auVar157._0_8_ = local_e38[lVar76].m_data[0];
    dVar187 = local_1360._0_8_;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         dVar187 * local_e38[lVar76].m_data[0];
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_e38[lVar76].m_data[1];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         dVar187 * local_e38[lVar76].m_data[1];
    auVar173._8_8_ = 0;
    auVar173._0_8_ = local_e38[lVar76].m_data[2];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         dVar187 * local_e38[lVar76].m_data[2];
    local_ec0 = auVar88._0_8_;
    uStack_eb8 = auVar88._8_8_;
    auVar87 = vmulsd_avx512f(auVar88,auVar157);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         auVar87._0_8_;
    auVar87 = vmulsd_avx512f(auVar88,auVar165);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar87._0_8_;
    auVar88 = vmulsd_avx512f(auVar88,auVar173);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_1340,auVar157);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_1340,auVar165);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_1340,auVar173);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar88._0_8_;
    auVar87 = vfmadd213sd_fma(auVar157,local_1360,auVar87);
    auVar87 = vfmadd231sd_avx512f(auVar87,local_1340,auVar173);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = auVar87._0_8_;
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
    _0_32_ = ZEXT832((ulong)local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array[8]);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
    _0_40_ = CONCAT832(local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array[8],
                       local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                       m_storage.m_data.array._0_32_);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
    _0_64_ = ZEXT4064((undefined1  [40])
                      local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array._0_40_);
    auVar158._8_8_ = 0;
    auVar158._0_8_ = local_f70[lVar76].m_data[0];
    auVar87 = vmulsd_avx512f(local_1200,auVar158);
    local_1258.m_lhs.m_lhs.m_lhs.m_matrix = auVar87._0_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = local_f70[lVar76].m_data[1];
    auVar87 = vmulsd_avx512f(local_1200,auVar166);
    local_1258.m_lhs.m_lhs.m_rhs = auVar87._0_8_;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = local_f70[lVar76].m_data[2];
    auVar87 = vmulsd_avx512f(local_1200,auVar174);
    local_1258.m_lhs.m_rhs = auVar87._0_8_;
    auVar87 = vmulsd_avx512f(local_1270,auVar158);
    local_1258.m_rhs.m_lhs.m_matrix = auVar87._0_8_;
    auVar87 = vmulsd_avx512f(local_1270,auVar166);
    local_1258.m_rhs.m_rhs = auVar87._0_8_;
    auVar88 = vmulsd_avx512f(local_1270,auVar174);
    local_1258._40_8_ = auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_11a0,auVar158);
    uStack_1228 = auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_11a0,auVar166);
    local_1220 = auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_11a0,auVar174);
    local_1218 = auVar88._0_8_;
    auVar87 = vfmadd213sd_avx512f(auVar158,local_1200,auVar87);
    auVar87 = vfmadd231sd_avx512f(auVar87,local_11a0,auVar174);
    local_1280 = auVar87._0_8_;
    _local_12c0 = ZEXT832(local_1280);
    _local_12c0 = CONCAT832(local_1280,_local_12c0);
    _local_12c0 = ZEXT4064(_local_12c0);
    auVar159._8_8_ = 0;
    auVar159._0_8_ = local_e48[lVar76].m_data[0];
    auVar87 = vmulsd_avx512f(local_1210,auVar159);
    local_1120.m_dst = auVar87._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = local_e48[lVar76].m_data[1];
    auVar87 = vmulsd_avx512f(local_1210,auVar167);
    local_1120.m_src = auVar87._0_8_;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_e48[lVar76].m_data[2];
    auVar87 = vmulsd_avx512f(local_1210,auVar175);
    local_1120.m_functor = auVar87._0_8_;
    auVar87 = vmulsd_avx512f(register0x000008fc,auVar159);
    local_1120.m_dstExpr = auVar87._0_8_;
    auVar87 = vmulsd_avx512f(register0x000008fc,auVar167);
    local_1100 = auVar87._0_8_;
    auVar88 = vmulsd_avx512f(register0x000008fc,auVar175);
    local_10f8 = auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_1150,auVar159);
    local_10f0 = auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_1150,auVar167);
    local_10e8 = auVar88._0_8_;
    auVar88 = vmulsd_avx512f(local_1150,auVar175);
    local_10e0 = auVar88._0_8_;
    auVar87 = vfmadd213sd_avx512f(auVar159,local_1210,auVar87);
    auVar87 = vfmadd231sd_avx512f(auVar87,local_1150,auVar175);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = auVar87._0_8_;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
    _0_64_ = ZEXT4064(CONCAT832(local_d00.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array[8],
                                ZEXT832((ulong)local_d00.
                                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                                               .m_storage.m_data.array[8])));
    local_d98 = local_e50[lVar76].m_data[0];
    auVar160._8_8_ = 0;
    auVar160._0_8_ = local_d98;
    auVar87 = vmulsd_avx512f(local_1170,auVar160);
    local_dc8.m_data[0] = auVar87._0_8_;
    local_d90 = local_e50[lVar76].m_data[1];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = local_d90;
    auVar87 = vmulsd_avx512f(local_1170,auVar168);
    local_dc8.m_data[1] = auVar87._0_8_;
    local_d88 = local_e50[lVar76].m_data[2];
    auVar176._8_8_ = 0;
    auVar176._0_8_ = local_d88;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = dVar131 * dVar3;
    auVar87 = vfmadd231sd_fma(auVar130,auVar184,auVar109);
    local_1160 = vfmadd231sd_fma(auVar87,auVar185,auVar137);
    auVar138._8_8_ = 0;
    auVar138._0_8_ = dVar131 * dVar4;
    auVar87 = vfmadd231sd_fma(auVar138,auVar145,auVar184);
    local_1090 = vfmadd231sd_fma(auVar87,auVar155,auVar185);
    auVar87 = vmulsd_avx512f(local_1170,auVar176);
    local_dc8.m_data[2] = auVar87._0_8_;
    local_da0 = local_1160._0_8_;
    local_db0 = local_da0 * local_d98;
    local_da8 = local_da0 * local_d90;
    local_da0 = local_d88 * local_da0;
    dVar131 = local_1090._0_8_;
    local_d98 = dVar131 * local_d98;
    local_d90 = dVar131 * local_d90;
    local_d88 = local_d88 * dVar131;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_da8;
    auVar87 = vfmadd213sd_avx512f(auVar160,local_1170,auVar110);
    auVar87 = vfmadd231sd_fma(auVar87,local_1090,auVar176);
    local_d40 = auVar87._0_8_;
    _local_d80 = ZEXT4064(CONCAT832(local_d40,ZEXT832(local_d40)));
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = (double)&local_1320;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = (double)&local_f40;
    pCStack_1038 = &local_1258;
    puStack_1028 = local_12c0;
    pgStack_1018 = &local_1120;
    pMStack_1008 = &local_d00;
    pCStack_ff8 = &local_dc8;
    puStack_fe8 = local_d80;
    ChMatrix33<double>::operator=
              (&local_bc0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
                *)&local_1080);
    pCVar58 = local_10d0;
    auVar94 = _local_12c0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    auVar111._0_8_ = local_1340._0_8_ ^ local_ca0;
    auVar111._8_8_ = local_1340._8_8_ ^ uStack_c98;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = (double)vmovlpd_avx(auVar111);
    auVar48._8_8_ = uStack_eb8;
    auVar48._0_8_ = local_ec0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = (double)local_ec0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)local_1340._0_8_;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    auVar87 = vunpcklpd_avx(local_1360,auVar48);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = (double)(auVar87._0_8_ ^ local_ca0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = (double)(auVar87._8_8_ ^ uStack_c98);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
    auVar112._0_8_ = local_11a0._0_8_ ^ local_ca0;
    auVar112._8_8_ = local_11a0._8_8_ ^ uStack_c98;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)vmovlpd_avx(auVar112);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1270._0_8_;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)local_11a0._0_8_;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
    auVar87 = vunpcklpd_avx(local_1200,local_1270);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         (double)(auVar87._0_8_ ^ local_ca0);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)(auVar87._8_8_ ^ uStack_c98);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_1200._0_8_;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
    auVar113._0_8_ = local_1150._0_8_ ^ local_ca0;
    auVar113._8_8_ = local_1150._8_8_ ^ uStack_c98;
    uVar5 = vmovlpd_avx(auVar113);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array.
    _0_40_ = ZEXT2440(CONCAT816(local_1150._0_8_,CONCAT88(local_11d0._32_8_,uVar5))) << 0x40;
    auVar87 = vunpcklpd_avx(local_1210,stack0xffffffffffffee50);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
         = (double)(auVar87._0_8_ ^ local_ca0);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
         = (double)(auVar87._8_8_ ^ uStack_c98);
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
         = (double)local_1210._0_8_;
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_1258.m_lhs.m_lhs.m_lhs.m_matrix = (non_const_type)0x0;
    auVar114._0_8_ = local_1090._0_8_ ^ local_ca0;
    auVar114._8_8_ = local_1090._8_8_ ^ uStack_c98;
    local_1258.m_lhs.m_lhs.m_rhs = (RhsNested)vmovlpd_avx(auVar114);
    local_1258.m_lhs.m_rhs = local_1160._0_8_;
    local_1258.m_rhs.m_lhs.m_matrix = (non_const_type)local_1090._0_8_;
    local_1258.m_rhs.m_rhs = (RhsNested)0x0;
    auVar87 = vunpcklpd_avx(local_1170,local_1160);
    local_1258._40_8_ = auVar87._0_8_ ^ local_ca0;
    uStack_1228 = auVar87._8_8_ ^ uStack_c98;
    local_1220 = local_1170._0_8_;
    local_1218 = 0;
    local_12c0._0_8_ =
         local_10d0[lVar76].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.
         m_storage.m_data.array + 0xb4;
    pCVar77 = local_10d0 + lVar76;
    local_12c0._8_8_ = 3;
    vStack_12b0.m_value = 3;
    auStack_12a8._0_8_ = pCVar77;
    auStack_12a8._8_8_ = 0xc;
    auStack_12a8._16_8_ = 0;
    auStack_12a8._32_8_ = auVar94._56_8_;
    auStack_12a8._24_8_ = 0xf;
    local_dc8.m_data[0] = (double)&local_1080;
    local_1120.m_dst = (DstEvaluatorType *)&local_d00;
    local_1120.m_src = (SrcEvaluatorType *)&local_dc8;
    local_1120.m_functor = (assign_op<double,_double> *)local_d80;
    local_1120.m_dstExpr = (DstXprType *)local_12c0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = dVar187;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_12c0._0_8_;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_1120);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)(pCVar58[lVar76].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>
                    .m_storage.m_data.array + 0xb7);
    local_12c0._8_8_ = 3;
    local_12c0._0_8_ =
         local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    vStack_12b0.m_value = 3;
    auStack_12a8._8_8_ = 0xc;
    auStack_12a8._16_8_ = 3;
    auStack_12a8._24_8_ = 0xf;
    local_dc8.m_data[0] = (double)&local_1320;
    local_1120.m_dst = (DstEvaluatorType *)&local_d00;
    local_1120.m_src = (SrcEvaluatorType *)&local_dc8;
    local_1120.m_functor = (assign_op<double,_double> *)local_d80;
    local_1120.m_dstExpr = (DstXprType *)local_12c0;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_1120);
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)(pCVar58[lVar76].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>
                    .m_storage.m_data.array + 0xba);
    local_12c0._8_8_ = 3;
    local_12c0._0_8_ =
         local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    vStack_12b0.m_value = 3;
    auStack_12a8._8_8_ = 0xc;
    auStack_12a8._16_8_ = 6;
    auStack_12a8._24_8_ = 0xf;
    local_dc8.m_data[0] = (double)&local_f40;
    local_1120.m_dst = (DstEvaluatorType *)&local_d00;
    local_1120.m_src = (SrcEvaluatorType *)&local_dc8;
    local_1120.m_functor = (assign_op<double,_double> *)local_d80;
    local_1120.m_dstExpr = (DstXprType *)local_12c0;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_1120);
    local_12c0._0_8_ =
         pCVar58[lVar76].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.m_storage.
         m_data.array + 0xbd;
    local_12c0._8_8_ = 3;
    vStack_12b0.m_value = 3;
    auStack_12a8._8_8_ = 0xc;
    auStack_12a8._16_8_ = 9;
    auStack_12a8._24_8_ = 0xf;
    local_dc8.m_data[0] = (double)&local_1258;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_12c0._0_8_;
    local_1120.m_dst = (DstEvaluatorType *)&local_d00;
    local_1120.m_src = (SrcEvaluatorType *)&local_dc8;
    local_1120.m_functor = (assign_op<double,_double> *)local_d80;
    local_1120.m_dstExpr = (DstXprType *)local_12c0;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_1120);
    local_1120.m_dst = (DstEvaluatorType *)&local_1080;
    local_12c0._8_8_ = 3;
    local_12c0._0_8_ =
         pCVar58[lVar76].super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>.m_storage.
         m_data.array + 0xc;
    vStack_12b0.m_value = 3;
    auStack_12a8._8_8_ = 0;
    auStack_12a8._16_8_ = 0xc;
    auStack_12a8._24_8_ = 0xf;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)local_12c0,
               (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1120);
    pCVar61 = local_e58;
    auVar94 = _local_12c0;
    if (((double)local_12c0._8_8_ != 1.48219693752374e-323) ||
       ((double)vStack_12b0.m_value != 1.48219693752374e-323)) {
LAB_007aaeb0:
      __function = 
      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 15, 15, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 15, 15, 1>>]"
      ;
LAB_007aaea6:
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,__function);
    }
    lVar80 = 0;
    do {
      lVar71 = 0;
      pdVar73 = (double *)local_1120.m_dst;
      do {
        *(double *)(local_12c0._0_8_ + lVar71 * 8) = *pdVar73;
        lVar71 = lVar71 + 1;
        pdVar73 = pdVar73 + 3;
      } while (lVar71 != 3);
      lVar80 = lVar80 + 1;
      local_1120.m_dst = (DstEvaluatorType *)((long)local_1120.m_dst + 8);
      local_12c0._0_8_ = local_12c0._0_8_ + 0x78;
    } while (lVar80 != 3);
    local_1120.m_dst = (DstEvaluatorType *)&local_1320;
    local_12c0._8_8_ = 3;
    local_12c0._0_8_ =
         (pCVar77->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>).m_storage.
         m_data.array + 0x39;
    vStack_12b0.m_value = 3;
    auStack_12a8._8_8_ = 3;
    auStack_12a8._16_8_ = 0xc;
    auStack_12a8._32_8_ = auVar94._56_8_;
    auStack_12a8._24_8_ = 0xf;
    Eigen::internal::
    check_for_aliasing<Eigen::Block<Eigen::Matrix<double,15,15,1,15,15>,_1,_1,false>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
              ((Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false> *)local_12c0,
               (Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_1120);
    auVar94 = _local_12c0;
    if (((double)local_12c0._8_8_ != 1.48219693752374e-323) ||
       ((double)vStack_12b0.m_value != 1.48219693752374e-323)) goto LAB_007aaeb0;
    lVar80 = 0;
    do {
      lVar71 = 0;
      pdVar73 = (double *)local_1120.m_dst;
      do {
        *(double *)(local_12c0._0_8_ + lVar71 * 8) = *pdVar73;
        lVar71 = lVar71 + 1;
        pdVar73 = pdVar73 + 3;
      } while (lVar71 != 3);
      lVar80 = lVar80 + 1;
      local_1120.m_dst = (DstEvaluatorType *)((long)local_1120.m_dst + 8);
      local_12c0._0_8_ = local_12c0._0_8_ + 0x78;
    } while (lVar80 != 3);
    local_12c0._0_8_ =
         (pCVar77->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_1,_15,_15>_>).m_storage.
         m_data.array + 0xc0;
    local_12c0._8_8_ = 3;
    vStack_12b0.m_value = 3;
    auStack_12a8._8_8_ = 0xc;
    auStack_12a8._16_8_ = 0xc;
    auStack_12a8._32_8_ = auVar94._56_8_;
    auStack_12a8._24_8_ = 0xf;
    local_dc8.m_data[0] = (double)&local_bc0;
    local_d00.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)local_12c0._0_8_;
    local_1120.m_dst = (DstEvaluatorType *)&local_d00;
    local_1120.m_src = (SrcEvaluatorType *)&local_dc8;
    local_1120.m_functor = (assign_op<double,_double> *)local_d80;
    local_1120.m_dstExpr = (DstXprType *)local_12c0;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run(&local_1120);
    lVar76 = lVar76 + 1;
    pCVar72 = local_1098 + 1;
    pdVar66 = pdVar66 + 3;
    pCVar65 = local_10a0 + 1;
    pCVar69 = local_10a8 + 1;
  } while (lVar76 != 4);
  lVar76 = 0;
  do {
    auVar115._8_8_ = 0;
    auVar115._0_8_ = this->alpha_i[lVar76];
    auVar46._8_8_ = 0x8000000000000000;
    auVar46._0_8_ = 0x8000000000000000;
    auVar87 = vxorpd_avx512vl(auVar115,auVar46);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(local_f78 + lVar76);
    local_1000 = 0;
    pCStack_ff8 = (ChVector<double> *)0x0;
    uStack_ff0 = 0;
    puStack_fe8 = (undefined1 *)0x0;
    uStack_fe0 = 0;
    uStack_fd8 = 0;
    uStack_fd0 = 0;
    uStack_fc8 = 0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    pCStack_1038 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)0x0;
    dStack_1030 = 0.0;
    puStack_1028 = (undefined1 *)0x0;
    uStack_1020 = 0;
    pgStack_1018 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    *)0x0;
    uStack_1010 = 0;
    pMStack_1008 = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         1.18575755001899e-322;
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
         = 4.94065645841247e-324;
    local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&this->stress_i[lVar76].
                    super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(0x18,0xc,(const_blas_data_mapper<double,_long,_0> *)&local_1320,
          (const_blas_data_mapper<double,_long,_1> *)&local_f40,(ResScalar *)&local_1080,1,
          auVar87._0_8_ * (double)(&w_i)[lVar76]);
    local_b40._8_8_ = pCStack_ff8;
    local_b40._0_8_ = local_1000;
    local_b40._16_8_ = uStack_ff0;
    local_b40._24_8_ = puStack_fe8;
    local_b40._32_8_ = uStack_fe0;
    local_b40._40_8_ = uStack_fd8;
    local_b40._48_8_ = uStack_fd0;
    local_b40._56_8_ = uStack_fc8;
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    dStack_b78 = (double)pCStack_1038;
    dStack_b70 = dStack_1030;
    dStack_b68 = (double)puStack_1028;
    uStack_b60 = uStack_1020;
    uStack_b58 = pgStack_1018;
    uStack_b50 = uStack_1010;
    uStack_b48 = pMStack_1008;
    if ((pCVar61->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        0x18) goto LAB_007aaec7;
    pdVar62 = (pCVar61->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    uVar85 = (ulong)(-((uint)((ulong)pdVar62 >> 3) & 0x1fffffff) & 7);
    if (((ulong)pdVar62 & 7) != 0) {
      uVar85 = 0x18;
    }
    if (uVar85 != 0) {
      uVar86 = 0;
      do {
        pdVar62[uVar86] =
             local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar86] + pdVar62[uVar86];
        uVar86 = uVar86 + 1;
      } while (uVar85 != uVar86);
    }
    uVar86 = (0x18U - (int)uVar85 & 0x18) + uVar85;
    if (((ulong)pdVar62 & 7) == 0) {
      do {
        auVar94 = vaddpd_avx512f(*(undefined1 (*) [64])
                                  (local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + uVar85),
                                 *(undefined1 (*) [64])(pdVar62 + uVar85));
        *(undefined1 (*) [64])(pdVar62 + uVar85) = auVar94;
        uVar85 = uVar85 + 8;
      } while (uVar85 < uVar86);
    }
    if ((uint)uVar86 < 0x18) {
      do {
        pdVar62[uVar86] =
             local_bc0.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
             [uVar86] + pdVar62[uVar86];
        uVar86 = uVar86 + 1;
      } while (uVar86 != 0x18);
    }
    lVar76 = lVar76 + 1;
  } while (lVar76 != 4);
  ChStateDelta::ChStateDelta((ChStateDelta *)&local_1258,0x18,(ChIntegrable *)0x0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1f])(this,0,&local_1258);
  uVar85 = (ulong)(-((uint)((ulong)(local_f40.
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                    m_storage.m_data.array + 3) >> 3) & 0x1fffffff) & 5);
  if (2 < uVar85) {
    uVar85 = 3;
  }
  uVar78 = -((uint)((ulong)(local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                            m_storage.m_data.array + 6) >> 3) & 0x1fffffff) & 6;
  if (2 < uVar78) {
    uVar78 = 3;
  }
  local_1210._0_8_ = 0x18;
  local_1270._0_8_ = uVar85;
  uVar85 = CONCAT44(0,(int)uVar85 * 8);
  local_1150._0_8_ = uVar85 ^ 0x18;
  uVar86 = CONCAT44(0,uVar78 * 8);
  local_1160._0_8_ = uVar86 ^ 0x18;
  local_1170._0_8_ = &local_f40;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uStack_11a8;
  stack0xffffffffffffee50 = auVar55 << 0x40;
  local_1090._0_8_ = local_d80;
  local_1278 = (double *)
               ((long)local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                      m_storage.m_data.array + uVar85 + 0x18);
  local_1200._0_8_ = uVar85;
  local_1178 = (double *)((long)local_f90.m_data + uVar85);
  local_1180 = (void *)((long)local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
                              .m_storage.m_data.array + uVar86 + 0x30);
  local_11a0._0_8_ = uVar86;
  local_1188 = (void *)((long)local_fb0.m_data + uVar86);
  lVar76 = 0;
  while( true ) {
    if ((ChMatrix33<double> *)local_1258.m_lhs.m_lhs.m_rhs != (ChMatrix33<double> *)0x18) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::Matrix<double, 12, 24, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 12, 24, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    lhs = local_f78 + lVar76;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    pCStack_1038 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)0x0;
    dStack_1030 = 0.0;
    puStack_1028 = (undefined1 *)0x0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_12c0._0_8_ = 0x3ff0000000000000;
    Eigen::internal::gemv_dense_selector<2,1,true>::
    run<Eigen::Matrix<double,12,24,1,12,24>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,12,1,0,12,1>>
              (lhs,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1258,
               (Matrix<double,_12,_1,_0,_12,_1> *)&local_1080,(Scalar *)local_12c0);
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    local_12d8._0_8_ = pCStack_1038;
    local_12d8._8_8_ = dStack_1030;
    local_12d8._16_8_ = puStack_1028;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)&local_1320;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1320;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)local_12c0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)(local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 3);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1320;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_1120,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)(local_1320.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + 6);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 2.96439387504748e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1320;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              ((ChVector<double> *)&local_d00,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = (double)local_12d8;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 1.48219693752374e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 4.44659081257122e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 5.92878775009496e-323;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = (double)&local_1320;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>>
              (&local_dc8,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
               &local_1080,(type *)0x0);
    dStack_d70 = 0.0;
    local_d80 = ZEXT816(0);
    local_f90.m_data[2] = 0.0;
    local_f90.m_data[0] = 0.0;
    local_f90.m_data[1] = 0.0;
    local_fb0.m_data[2] = 0.0;
    local_fb0.m_data[0] = 0.0;
    local_fb0.m_data[1] = 0.0;
    local_de0.m_data[2] = 0.0;
    local_de0.m_data[0] = 0.0;
    local_de0.m_data[1] = 0.0;
    local_e00.m_data[2] = 0.0;
    local_e00.m_data[0] = 0.0;
    local_e00.m_data[1] = 0.0;
    local_11d0._16_8_ = 0.0;
    local_11d0._0_8_ = 0.0;
    local_11d0._8_8_ = 0.0;
    local_11e0 = 0.0;
    local_11f0 = 0.0;
    dStack_11e8 = 0.0;
    pLVar64 = (this->m_layers).
              super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_layers).
        super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
        ._M_impl.super__Vector_impl_data._M_finish == pLVar64) {
      local_ec0 = (double *)0x0;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_1360._8_8_;
      local_1360 = auVar53 << 0x40;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_1340._8_8_;
      local_1340 = auVar54 << 0x40;
    }
    else {
      local_ec0 = (double *)0x0;
      lVar80 = 0;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_1360._8_8_;
      local_1360 = auVar51 << 0x40;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_1340._8_8_;
      local_1340 = auVar52 << 0x40;
      uVar85 = 0;
      do {
        lVar71 = *(long *)((long)&(pLVar64->m_material).
                                  super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar80);
        p_Var42 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(pLVar64->m_material).
                           super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar80);
        if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
          }
        }
        lVar44 = *(long *)(lVar71 + 0x28);
        p_Var45 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar71 + 0x30);
        if (p_Var45 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var45->_M_use_count = p_Var45->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var45->_M_use_count = p_Var45->_M_use_count + 1;
          }
        }
        if (p_Var45 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var45);
        }
        if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var42);
        }
        if (lVar44 != 0) {
          pLVar64 = (this->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar71 = *(long *)((long)&(pLVar64->m_material).
                                    super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + lVar80);
          p_Var42 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(pLVar64->m_material).
                             super___shared_ptr<chrono::fea::ChMaterialShellReissner,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + lVar80);
          if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var42->_M_use_count = p_Var42->_M_use_count + 1;
            }
          }
          plVar41 = *(long **)(lVar71 + 0x28);
          p_Var45 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar71 + 0x30);
          if (p_Var45 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var45->_M_use_count = p_Var45->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var45->_M_use_count = p_Var45->_M_use_count + 1;
            }
          }
          pdVar43 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          (**(code **)(*plVar41 + 0x10))
                    (pdVar43[uVar85],pdVar43[uVar85 + 1],
                     *(undefined8 *)
                      ((long)&((this->m_layers).
                               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_theta + lVar80),plVar41
                     ,&local_de0,&local_e00,local_11d0,&local_11f0,local_12c0,&local_1120,&local_d00
                     ,&local_dc8);
          if (p_Var45 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var45);
          }
          if (p_Var42 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var42);
          }
          auVar94 = _local_d80;
          local_d80._8_8_ = local_de0.m_data[1] + (double)local_d80._8_8_;
          local_d80._0_8_ = local_de0.m_data[0] + (double)local_d80._0_8_;
          dStack_d70 = auVar94._16_8_;
          auStack_d68 = auVar94._24_40_;
          dStack_d70 = local_de0.m_data[2] + dStack_d70;
          local_f90.m_data[0] = local_e00.m_data[0] + local_f90.m_data[0];
          local_f90.m_data[1] = local_e00.m_data[1] + local_f90.m_data[1];
          local_f90.m_data[2] = local_e00.m_data[2] + local_f90.m_data[2];
          local_fb0.m_data[0] = (double)local_11d0._0_8_ + local_fb0.m_data[0];
          local_fb0.m_data[1] = (double)local_11d0._8_8_ + local_fb0.m_data[1];
          local_fb0.m_data[2] = (double)local_11d0._16_8_ + local_fb0.m_data[2];
          local_ec0 = (double *)((double)local_ec0 + local_11f0);
          local_1360._0_8_ = (double)local_1360._0_8_ + dStack_11e8;
          local_1340._0_8_ = (double)local_1340._0_8_ + local_11e0;
        }
        uVar85 = uVar85 + 1;
        pLVar64 = (this->m_layers).
                  super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar80 = lVar80 + 0x28;
      } while (uVar85 < (ulong)(((long)(this->m_layers).
                                       super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar64 >>
                                3) * -0x3333333333333333));
    }
    pCVar61 = local_e58;
    memcpy((void *)local_1170._0_8_,(void *)local_1090._0_8_,local_1210._0_8_);
    memcpy(local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array + 3,&local_f90,local_1200._0_8_);
    if (local_1270._0_4_ != 3) {
      memcpy(local_1278,local_1178,local_1150._0_8_);
    }
    memcpy(local_f40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array + 6,&local_fb0,local_11a0._0_8_);
    if (uVar78 != 3) {
      memcpy(local_1180,local_1188,local_1160._0_8_);
    }
    local_ef8 = local_ec0;
    local_ef0 = local_1360._0_8_;
    local_ee8 = local_1340._0_8_;
    if ((pCVar61->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        0x18) break;
    pdVar62 = (pCVar61->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = this->alpha_i[lVar76];
    auVar47._8_8_ = 0x8000000000000000;
    auVar47._0_8_ = 0x8000000000000000;
    auVar87 = vxorpd_avx512vl(auVar116,auVar47);
    local_1000 = 0;
    pCStack_ff8 = (ChVector<double> *)0x0;
    uStack_ff0 = 0;
    puStack_fe8 = (undefined1 *)0x0;
    uStack_fe0 = 0;
    uStack_fd8 = 0;
    uStack_fd0 = 0;
    uStack_fc8 = 0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    pCStack_1038 = (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                    *)0x0;
    dStack_1030 = 0.0;
    puStack_1028 = (undefined1 *)0x0;
    uStack_1020 = 0;
    pgStack_1018 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_15,_15,_1,_15,_15>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
                    *)0x0;
    uStack_1010 = 0;
    pMStack_1008 = (Matrix<double,_3,_3,_1,_3,_3> *)0x0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [0] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [1] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [2] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [3] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [4] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [5] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [6] = 0.0;
    local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
    [7] = 0.0;
    local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 0x18;
    local_e70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)&local_f40;
    local_e70.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 1;
    local_1140.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = (double *)lhs;
    Eigen::internal::
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_0,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_false,_0>
    ::run(0x18,0xc,&local_1140,&local_e70,(ResScalar *)&local_1080,1,
          auVar87._0_8_ * (double)(&w_i)[lVar76]);
    uVar85 = (ulong)(-((uint)((ulong)pdVar62 >> 3) & 0x1fffffff) & 7);
    if (((ulong)pdVar62 & 7) != 0) {
      uVar85 = 0x18;
    }
    if (uVar85 != 0) {
      uVar86 = 0;
      do {
        pdVar62[uVar86] =
             local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array[uVar86] + pdVar62[uVar86];
        uVar86 = uVar86 + 1;
      } while (uVar85 != uVar86);
    }
    uVar86 = (0x18U - (int)uVar85 & 0x18) + uVar85;
    if (((ulong)pdVar62 & 7) == 0) {
      do {
        auVar94 = vaddpd_avx512f(*(undefined1 (*) [64])
                                  (local_1080.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                   m_storage.m_data.array + uVar85),
                                 *(undefined1 (*) [64])(pdVar62 + uVar85));
        *(undefined1 (*) [64])(pdVar62 + uVar85) = auVar94;
        uVar85 = uVar85 + 8;
      } while (uVar85 < uVar86);
    }
    if ((uint)uVar86 < 0x18) {
      do {
        pdVar62[uVar86] =
             local_1080.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
             m_data.array[uVar86] + pdVar62[uVar86];
        uVar86 = uVar86 + 1;
      } while (uVar86 != 0x18);
    }
    lVar76 = lVar76 + 1;
    if (lVar76 == 4) {
      if (local_1258.m_lhs.m_lhs.m_lhs.m_matrix != (non_const_type)0x0) {
        free((void *)(((ChMatrix33<double> *)(local_1258.m_lhs.m_lhs.m_lhs.m_matrix + -1))->
                     super_Matrix<double,_3,_3,_1,_3,_3>).
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]);
      }
      return;
    }
  }
LAB_007aaec7:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementShellReissner4::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    Fi.setZero();

    UpdateNodalAndAveragePosAndOrientation();
    InterpolateOrientation();

    /*
	for (unsigned int i = 1; i <= iGetNumDof(); i++) {
		beta(i) = XCurr(iFirstReactionIndex + i);
	}
    */  //***TODO*** EAS internal variables not yet implemented

    ComputeIPCurvature();
    for (int i = 0; i < NUMIP; i++) {
        InterpDeriv(xa, L_alpha_beta_i[i], y_i_1[i], y_i_2[i]);
        eps_tilde_1_i[i] = T_i[i].transpose() * y_i_1[i] - eps_tilde_1_0_i[i];
        eps_tilde_2_i[i] = T_i[i].transpose() * y_i_2[i] - eps_tilde_2_0_i[i];
        k_tilde_1_i[i] = T_i[i].transpose() * k_1_i[i] - k_tilde_1_0_i[i];
        k_tilde_2_i[i] = T_i[i].transpose() * k_2_i[i] - k_tilde_2_0_i[i];

        ChStarMatrix33<> myi_1_X(y_i_1[i]);
        ChStarMatrix33<> myi_2_X(y_i_2[i]);
        ChStarMatrix33<> mk_1_X(k_1_i[i]);
        ChStarMatrix33<> mk_2_X(k_2_i[i]);
        ChMatrix33<> block;

        // parte variabile di B_overline_i
        for (int n = 0; n < NUMNODES; n++) {
            ChMatrix33<> Phi_Delta_i_n_LI_i = Phi_Delta_i[i][n] * LI[n](xi_i[i]);

            // delta epsilon_tilde_1_i
            block = T_i[i] * L_alpha_beta_i[i](n, 0);
            B_overline_i[i].block(0, 6 * n, 3, 3) = block.transpose();
            block = T_i[i].transpose() * myi_1_X * Phi_Delta_i_n_LI_i;
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(0, 3 + 6 * n, 3, 3) = block;

            // delta epsilon_tilde_2_i
            block = T_i[i] * L_alpha_beta_i[i](n, 1);
            B_overline_i[i].block(3, 6 * n, 3, 3) = block.transpose();
            block = T_i[i].transpose() * myi_2_X * Phi_Delta_i_n_LI_i;
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(3, 3 + 6 * n, 3, 3) = block;

            ChVector<> phi_tilde_1_i;
            ChVector<> phi_tilde_2_i;
            InterpDeriv(phi_tilde_n, L_alpha_beta_i[i], phi_tilde_1_i, phi_tilde_2_i);

            // delta k_tilde_1_i
            block = T_i[i].transpose() * mk_1_X * Phi_Delta_i_n_LI_i + T_i[i].transpose() * Kappa_delta_i_1[i][n];
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(6, 3 + 6 * n, 3, 3) = block;

            // delta k_tilde_2_i
            block = T_i[i].transpose() * mk_2_X * Phi_Delta_i_n_LI_i + T_i[i].transpose() * Kappa_delta_i_2[i][n];
            block = block * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            B_overline_i[i].block(9, 3 + 6 * n, 3, 3) = block;

            // delta y_alpha_1
            block = ChMatrix33<>::Identity() * L_alpha_beta_i[i](n, 0);
            D_overline_i[i].block(0, 6 * n, 3, 3) = block;

            // delta y_alpha_2
            block = ChMatrix33<>::Identity() * L_alpha_beta_i[i](n, 1);
            D_overline_i[i].block(3, 6 * n, 3, 3) = block;

            // delta k_1_i
            block = Kappa_delta_i_1[i][n] * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(6, 3 + 6 * n, 3, 3) = block;

            // delta k_2_i
            block = Kappa_delta_i_2[i][n] * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(9, 3 + 6 * n, 3, 3) = block;

            // phi_delta
            block = Phi_Delta_i_n_LI_i * m_nodes[n]->GetA();  //***NEEDED because rotations are body-relative
            D_overline_i[i].block(12, 3 + 6 * n, 3, 3) = block;
        }
    }

// ANS
#ifdef CHUSE_ANS

    ChMatrixNM<double, 6, 24> B_overline_A;
    ChVector<> y_A_1;
    ChVector<> y_A_2;
    ChMatrixNM<double, 4, 24> B_overline_3_ABCD;
    ChMatrixNM<double, 4, 24> B_overline_6_ABCD;

    for (int i = 0; i < NUMSSEP; i++) {
        B_overline_A.setZero();
        InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
        eps_tilde_1_A[i] = T_A[i].transpose() * y_A_1 - eps_tilde_1_0_A[i];
        eps_tilde_2_A[i] = T_A[i].transpose() * y_A_2 - eps_tilde_2_0_A[i];

        ChStarMatrix33<> myA_1_X(y_A_1);
        ChStarMatrix33<> myA_2_X(y_A_2);
        ChMatrix33<> block;

        for (int n = 0; n < NUMNODES; n++) {
            ChMatrix33<> Phi_Delta_A_n_LI_i = Phi_Delta_A[i][n] * LI[n](xi_A[i]);

            // delta epsilon_tilde_1_A
            block = T_A[i].transpose() * L_alpha_beta_A[i](n, 0);
            B_overline_A.block(0, 6 * n, 3, 3) = block;
            block = T_A[i].transpose() * myA_1_X * Phi_Delta_A_n_LI_i;
            block = block * this->m_nodes[n]->GetA();  //***NEEDED because in chrono rotations are body-relative
            B_overline_A.block(0, 3 + 6 * n, 3, 3) = block;

            // delta epsilon_tilde_2_A
            block = T_A[i].transpose() * L_alpha_beta_A[i](n, 1);
            B_overline_A.block(3, 6 * n, 3, 3) = block;
            block = T_A[i].transpose() * myA_2_X * Phi_Delta_A_n_LI_i;
            block = block * this->m_nodes[n]->GetA();  //***NEEDED because in chrono rotations are body-relative
            B_overline_A.block(3, 3 + 6 * n, 3, 3) = block;
        }

        B_overline_3_ABCD.row(i) = B_overline_A.row(2);
        B_overline_6_ABCD.row(i) = B_overline_A.row(5);
    }

    for (int i = 0; i < NUMIP; i++) {
        ChMatrixNM<double, 1, 4> sh1;
        ChMatrixNM<double, 1, 4> sh2;
        sh1(0, 0) = (1. + xi_i[i][1]) * 0.5;
        sh1(0, 1) = 0;
        sh1(0, 2) = (1. - xi_i[i][1]) * 0.5;
        sh1(0, 3) = 0;

        sh2(0, 0) = 0;
        sh2(0, 1) = (1. - xi_i[i][0]) * 0.5;
        sh2(0, 2) = 0;
        sh2(0, 3) = (1. + xi_i[i][0]) * 0.5;

        eps_tilde_1_i[i].z() = sh1(0, 0) * eps_tilde_1_A[0].z() + sh1(0, 2) * eps_tilde_1_A[2].z();
        eps_tilde_2_i[i].z() = sh2(0, 1) * eps_tilde_2_A[1].z() + sh2(0, 3) * eps_tilde_2_A[3].z();

        B_overline_i[i].row(2) = sh1 * B_overline_3_ABCD;
        B_overline_i[i].row(5) = sh2 * B_overline_6_ABCD;
    }

#endif

    // EAS: B membranali
    // 	{
    // 		int tmpidx1[5] = {0, 1, 5, 4, 2};
    // 		for (int i = 0; i < NUMIP; i++) {
    // 			for (int n = 1; n <= 4; n++) {
    //#if 0
    // 				CopyMatrixRow(B_overline_m_i[i], n, B_overline_i[i], tmpidx1[n]);
    //#endif
    // 				B_overline_m_i[i].CopyMatrixRow(n, B_overline_i[i], tmpidx1[n]);
    // 			}
    // 		}
    // 	}

    /* Calcola le azioni interne */
    for (int i = 0; i < NUMIP; i++) {
        epsilon.segment(0, 3) = eps_tilde_1_i[i].eigen();
        epsilon.segment(3, 3) = eps_tilde_2_i[i].eigen();
        epsilon.segment(6, 3) = k_tilde_1_i[i].eigen();
        epsilon.segment(9, 3) = k_tilde_2_i[i].eigen();

        //***TODO*** add the EAS effect using the epsilon_hat
        // epsilon_hat = P_i[i] * beta;
        // epsilon += epsilon_hat;

        ChVector<> eps_tot_1(epsilon.segment(0, 3));
        ChVector<> eps_tot_2(epsilon.segment(3, 3));
        ChVector<> k_tot_1(epsilon.segment(6, 3));
        ChVector<> k_tot_2(epsilon.segment(9, 3));

        // Compute strains using
        // constitutive law of material

        ChVector<> n1, n2, m1, m2;
        ChVector<> l_n1, l_n2, l_m1, l_m2;
        // loop on layers
        for (size_t il = 0; il < this->m_layers.size(); ++il) {
            // compute layer stresses (per-unit-length forces and torques), and accumulate
            m_layers[il].GetMaterial()->ComputeStress(l_n1, l_n2, l_m1, l_m2, eps_tot_1, eps_tot_2, k_tot_1, k_tot_2,
                                                      m_layers_z[il], m_layers_z[il + 1], m_layers[il].Get_theta());
            n1 += l_n1;
            n2 += l_n2;
            m1 += l_m1;
            m2 += l_m2;
        }

        stress_i[i].segment(0,3) = n1.eigen();
        stress_i[i].segment(3,3) = n2.eigen();
        stress_i[i].segment(6,3) = m1.eigen();
        stress_i[i].segment(9,3) = m2.eigen();

        ChMatrix33<> Hh;
        ChVector<> Tn1 = T_i[i] * n1;
        ChVector<> Tn2 = T_i[i] * n2;
        ChVector<> Tm1 = T_i[i] * m1;
        ChVector<> Tm2 = T_i[i] * m2;
        Hh = TensorProduct(Tn1, y_i_1[i]) - ChMatrix33<>(Tn1 ^ y_i_1[i]) + TensorProduct(Tn2, y_i_2[i]) -
             ChMatrix33<>(Tn2 ^ y_i_2[i]) + TensorProduct(Tm1, k_1_i[i]) - ChMatrix33<>(Tm1 ^ k_1_i[i]) +
             TensorProduct(Tm2, k_2_i[i]) - ChMatrix33<>(Tm2 ^ k_2_i[i]);

        ChStarMatrix33<> Tn1_tilde(Tn1);
        ChStarMatrix33<> Tn2_tilde(Tn2);
        ChStarMatrix33<> Tm1_tilde(Tm1);
        ChStarMatrix33<> Tm2_tilde(Tm2);

        G_i[i].block(12, 0, 3, 3) = Tn1_tilde;
        G_i[i].block(12, 3, 3, 3) = Tn2_tilde;
        G_i[i].block(12, 6, 3, 3) = Tm1_tilde;
        G_i[i].block(12, 9, 3, 3) = Tm2_tilde;
        G_i[i].block(0, 12, 3, 3) = Tn1_tilde.transpose();
        G_i[i].block(3, 12, 3, 3) = Tn2_tilde.transpose();
        G_i[i].block(12, 12, 3, 3) = Hh;
    }

    // Residual

    ChVectorN<double, 24> rd;
    for (int i = 0; i < NUMIP; i++) {
        rd = (-alpha_i[i] * w_i[i]) * B_overline_i[i].transpose() * stress_i[i];
        Fi.segment(0, 24) += rd;

#ifdef CHUSE_EAS
        double dCoef = 1.0;  //***TODO*** autoset this
        ChVectorN<double, IDOFS> rbeta;
        rbeta = (-alpha_i[i] * w_i[i] / dCoef) * P_i[i].transpose() * stress_i[i];
        Fi.segment(24, IDOFS) = rbeta;
#endif
    }

    // Add damping: 

    // fills velocities with speeds of nodes:
    // {dxdt_1, angular_vel_1,  dxdt_2, angular_vel_2, ...}
    // Note that angular velocities are in node local frame because in C::E angular
    // increments are assumed in local frame csys.
    ChStateDelta velocities(24, nullptr);
    this->LoadableGetStateBlock_w(0, velocities);

    // Note that, in case of ChDampingReissnerRayleigh (rayleigh damping), this
	// is like computing Fi_damping = -beta*[Km]*v   without explicitly building [Km],
    // rather exploit the factorization B'CB, as:
    //   Alpha*[Km]*v = beta * [sum_integraton_points ( [B_i]'*[C]*[B_i] * a_i * w_i )] *v
    //   Alpha*[Km]*v = sum_integraton_points ( [B_i]' * (beta * [C]*[B_i] *v) * a_i * w_i )
    //   Alpha*[Km]*v = sum_integraton_points ( [B_i]' * (   stress_damp_i    ) * a_i * w_i )
    // where for convenience we denoted stress_damp = beta*[C]*[B_i]*v

    ChVectorN<double, 12> strain_dt;
    ChVectorN<double, 12> stress_damp;

    for (int i = 0; i < NUMIP; i++) {
			
        strain_dt = B_overline_i[i] * velocities;  // [B_i] *v

        ChVector<> eps_dt_1(strain_dt.segment(0, 3));
        ChVector<> eps_dt_2(strain_dt.segment(3, 3));
        ChVector<> k_dt_1(strain_dt.segment(6, 3));
        ChVector<> k_dt_2(strain_dt.segment(9, 3));
        ChVector<> n1, n2, m1, m2;
        ChVector<> l_n1, l_n2, l_m1, l_m2;
        // loop on layers
        for (size_t il = 0; il < this->m_layers.size(); ++il) {

			if (m_layers[il].GetMaterial()->GetDamping()) {

				// compute layer stresses (per-unit-length forces and torques), and accumulate  [C]*[B_i]*v
				m_layers[il].GetMaterial()->GetDamping()->ComputeStress(l_n1, l_n2, l_m1, l_m2, eps_dt_1, eps_dt_2, k_dt_1, k_dt_2,
					m_layers_z[il], m_layers_z[il + 1], m_layers[il].Get_theta());
				n1 += l_n1;
				n2 += l_n2;
				m1 += l_m1;
				m2 += l_m2;
			}
        }
        stress_damp.segment(0, 3) = n1.eigen();
        stress_damp.segment(3, 3) = n2.eigen();
        stress_damp.segment(6, 3) = m1.eigen();
        stress_damp.segment(9, 3) = m2.eigen();

        Fi.segment(0, 24) += (-alpha_i[i] * w_i[i]) * B_overline_i[i].transpose() * stress_damp;
    }


}